

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int ncnn::binary_op_broadcast_inner(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  uint uVar24;
  int *extraout_RAX;
  void *pvVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  void *pvVar31;
  undefined1 (*pauVar32) [32];
  int y_1;
  float *pfVar33;
  void *pvVar34;
  int y;
  float *pfVar35;
  void *pvVar36;
  undefined1 (*pauVar37) [32];
  ulong uVar38;
  void *pvVar39;
  int z_1;
  int *piVar40;
  long lVar41;
  void *pvVar42;
  int iVar43;
  long lVar44;
  float fVar45;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar137;
  float fVar138;
  undefined1 auVar132 [16];
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar150 [64];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  __m128 afVar155;
  binary_op_ratan2 op;
  __m128 _b_128;
  __m256 _p;
  __m256 _b_256;
  binary_op_ratan2 local_1c9;
  void *local_1c8;
  Mat *local_1c0;
  void *local_1b8;
  int local_1ac;
  void *local_1a8;
  void *local_1a0;
  Mat *local_198;
  Allocator *local_190;
  int *local_188;
  undefined1 local_180 [16];
  size_t local_168;
  uint local_160;
  int iStack_15c;
  undefined8 uStack_158;
  size_t local_148;
  void *local_140;
  void *local_138;
  undefined1 local_130 [16];
  size_t local_118;
  void *local_110;
  int local_104;
  __m128 local_100;
  void *local_f0;
  void *local_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  float afStack_d0 [2];
  float afStack_c8 [6];
  void *local_b0;
  size_t local_a8;
  Mat local_a0;
  undefined1 auVar80 [28];
  
  pvVar25 = b->data;
  local_188 = b->refcount;
  local_168 = b->elemsize;
  local_190 = b->allocator;
  uVar52._0_4_ = b->dims;
  uVar52._4_4_ = b->w;
  local_148 = b->cstep;
  uVar51 = uVar52;
  if (local_188 != (int *)0x0) {
    LOCK();
    *local_188 = *local_188 + 1;
    UNLOCK();
    uVar51._0_4_ = b->dims;
    uVar51._4_4_ = b->w;
  }
  uVar24 = (uint)uVar51;
  uVar29 = SUB84(uVar51,4) ^ 1;
  local_1c0 = a;
  local_198 = c;
  if (uVar24 == 2 && uVar29 == 0) {
    Mat::reshape(&local_a0,b,b->h,(Allocator *)0x0);
    if (local_a0.refcount != (int *)0x0) {
      LOCK();
      *local_a0.refcount = *local_a0.refcount + 1;
      UNLOCK();
    }
    if (local_188 != (int *)0x0) {
      LOCK();
      *local_188 = *local_188 + -1;
      UNLOCK();
      if (*local_188 == 0) {
        if (local_190 == (Allocator *)0x0) {
          free(pvVar25);
        }
        else {
          (*local_190->_vptr_Allocator[3])(local_190,pvVar25);
        }
      }
    }
    pvVar25 = local_a0.data;
    piVar40 = local_a0.refcount;
    local_168 = local_a0.elemsize;
    local_190 = local_a0.allocator;
    local_148 = local_a0.cstep;
    uVar52 = local_a0._40_8_;
    if (local_a0.refcount == (int *)0x0) goto LAB_0036e331;
    LOCK();
    *local_a0.refcount = *local_a0.refcount + -1;
    UNLOCK();
    if (*local_a0.refcount != 0) goto LAB_0036e331;
    local_160 = local_a0.dims;
    iStack_15c = local_a0.w;
    uStack_158 = 0;
    if (local_a0.allocator != (Allocator *)0x0) {
      (*(local_a0.allocator)->_vptr_Allocator[3])();
      uVar52._4_4_ = iStack_15c;
      uVar52._0_4_ = local_160;
      goto LAB_0036e331;
    }
  }
  else {
    uVar1 = b->h;
    if ((uVar24 ^ 3) == 0 && (uVar1 ^ 1) == 0) {
      Mat::reshape(&local_a0,b,b->c,(Allocator *)0x0);
      if (local_a0.refcount != (int *)0x0) {
        LOCK();
        *local_a0.refcount = *local_a0.refcount + 1;
        UNLOCK();
      }
      if (local_188 != (int *)0x0) {
        LOCK();
        *local_188 = *local_188 + -1;
        UNLOCK();
        if (*local_188 == 0) {
          if (local_190 == (Allocator *)0x0) {
            free(pvVar25);
          }
          else {
            (*local_190->_vptr_Allocator[3])(local_190,pvVar25);
          }
        }
      }
      pvVar25 = local_a0.data;
      piVar40 = local_a0.refcount;
      local_168 = local_a0.elemsize;
      local_190 = local_a0.allocator;
      local_148 = local_a0.cstep;
      uVar52 = local_a0._40_8_;
      if (local_a0.refcount == (int *)0x0) goto LAB_0036e331;
      LOCK();
      *local_a0.refcount = *local_a0.refcount + -1;
      UNLOCK();
      if (*local_a0.refcount != 0) goto LAB_0036e331;
      local_160 = local_a0.dims;
      iStack_15c = local_a0.w;
      uStack_158 = 0;
      if (local_a0.allocator != (Allocator *)0x0) {
        (*(local_a0.allocator)->_vptr_Allocator[3])();
        uVar52._4_4_ = iStack_15c;
        uVar52._0_4_ = local_160;
        goto LAB_0036e331;
      }
    }
    else if ((uVar24 ^ 3) == 0 && uVar29 == 0) {
      Mat::reshape(&local_a0,b,uVar1,b->c,(Allocator *)0x0);
      if (local_a0.refcount != (int *)0x0) {
        LOCK();
        *local_a0.refcount = *local_a0.refcount + 1;
        UNLOCK();
      }
      if (local_188 != (int *)0x0) {
        LOCK();
        *local_188 = *local_188 + -1;
        UNLOCK();
        if (*local_188 == 0) {
          if (local_190 == (Allocator *)0x0) {
            free(pvVar25);
          }
          else {
            (*local_190->_vptr_Allocator[3])(local_190,pvVar25);
          }
        }
      }
      pvVar25 = local_a0.data;
      piVar40 = local_a0.refcount;
      local_168 = local_a0.elemsize;
      local_190 = local_a0.allocator;
      local_148 = local_a0.cstep;
      uVar52 = local_a0._40_8_;
      if (local_a0.refcount == (int *)0x0) goto LAB_0036e331;
      LOCK();
      *local_a0.refcount = *local_a0.refcount + -1;
      UNLOCK();
      if (*local_a0.refcount != 0) goto LAB_0036e331;
      local_160 = local_a0.dims;
      iStack_15c = local_a0.w;
      uStack_158 = 0;
      if (local_a0.allocator != (Allocator *)0x0) {
        (*(local_a0.allocator)->_vptr_Allocator[3])();
        uVar52._4_4_ = iStack_15c;
        uVar52._0_4_ = local_160;
        goto LAB_0036e331;
      }
    }
    else {
      uVar24 = uVar24 ^ 4;
      iVar43 = b->d;
      if (iVar43 == 1 && uVar24 == 0) {
        Mat::reshape(&local_a0,b,b->c,(Allocator *)0x0);
        if (local_a0.refcount != (int *)0x0) {
          LOCK();
          *local_a0.refcount = *local_a0.refcount + 1;
          UNLOCK();
        }
        if (local_188 != (int *)0x0) {
          LOCK();
          *local_188 = *local_188 + -1;
          UNLOCK();
          if (*local_188 == 0) {
            if (local_190 == (Allocator *)0x0) {
              free(pvVar25);
            }
            else {
              (*local_190->_vptr_Allocator[3])(local_190,pvVar25);
            }
          }
        }
        pvVar25 = local_a0.data;
        piVar40 = local_a0.refcount;
        local_168 = local_a0.elemsize;
        local_190 = local_a0.allocator;
        local_148 = local_a0.cstep;
        uVar52 = local_a0._40_8_;
        if (local_a0.refcount == (int *)0x0) goto LAB_0036e331;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_0036e331;
        local_160 = local_a0.dims;
        iStack_15c = local_a0.w;
        uStack_158 = 0;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          uVar52._4_4_ = iStack_15c;
          uVar52._0_4_ = local_160;
          goto LAB_0036e331;
        }
      }
      else if ((uVar1 ^ 1) == 0 && uVar24 == 0) {
        Mat::reshape(&local_a0,b,iVar43,b->c,(Allocator *)0x0);
        if (local_a0.refcount != (int *)0x0) {
          LOCK();
          *local_a0.refcount = *local_a0.refcount + 1;
          UNLOCK();
        }
        if (local_188 != (int *)0x0) {
          LOCK();
          *local_188 = *local_188 + -1;
          UNLOCK();
          if (*local_188 == 0) {
            if (local_190 == (Allocator *)0x0) {
              free(pvVar25);
            }
            else {
              (*local_190->_vptr_Allocator[3])(local_190,pvVar25);
            }
          }
        }
        pvVar25 = local_a0.data;
        piVar40 = local_a0.refcount;
        local_168 = local_a0.elemsize;
        local_190 = local_a0.allocator;
        local_148 = local_a0.cstep;
        uVar52 = local_a0._40_8_;
        if (local_a0.refcount == (int *)0x0) goto LAB_0036e331;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_0036e331;
        local_160 = local_a0.dims;
        iStack_15c = local_a0.w;
        uStack_158 = 0;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          uVar52._4_4_ = iStack_15c;
          uVar52._0_4_ = local_160;
          goto LAB_0036e331;
        }
      }
      else {
        piVar40 = local_188;
        if (uVar24 != 0 || uVar29 != 0) goto LAB_0036e331;
        Mat::reshape(&local_a0,b,uVar1,iVar43,b->c,(Allocator *)0x0);
        if (local_a0.refcount != (int *)0x0) {
          LOCK();
          *local_a0.refcount = *local_a0.refcount + 1;
          UNLOCK();
        }
        if (local_188 != (int *)0x0) {
          LOCK();
          *local_188 = *local_188 + -1;
          UNLOCK();
          if (*local_188 == 0) {
            if (local_190 == (Allocator *)0x0) {
              free(pvVar25);
            }
            else {
              (*local_190->_vptr_Allocator[3])(local_190,pvVar25);
            }
          }
        }
        pvVar25 = local_a0.data;
        piVar40 = local_a0.refcount;
        local_168 = local_a0.elemsize;
        local_190 = local_a0.allocator;
        local_148 = local_a0.cstep;
        uVar52 = local_a0._40_8_;
        if (local_a0.refcount == (int *)0x0) goto LAB_0036e331;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_0036e331;
        local_160 = local_a0.dims;
        iStack_15c = local_a0.w;
        uStack_158 = 0;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          uVar52._4_4_ = iStack_15c;
          uVar52._0_4_ = local_160;
          goto LAB_0036e331;
        }
      }
    }
  }
  uStack_158 = 0;
  free(pvVar25);
  uVar52._4_4_ = iStack_15c;
  uVar52._0_4_ = local_160;
LAB_0036e331:
  local_188 = piVar40;
  local_1c8 = pvVar25;
  if ((uint)op_type < 0xc) {
    iVar43 = (int)uVar52;
    local_1a8 = (void *)CONCAT44(local_1a8._4_4_,iVar43);
    local_1ac = SUB84(uVar52,4);
    switch(op_type) {
    case 0:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036e3f6:
            auVar81._16_16_ = auVar55;
            auVar81._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036e3f6;
            auVar81 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pfVar33 = (float *)((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar116._0_4_ = auVar81._0_4_ + *pfVar33;
            auVar116._4_4_ = auVar81._4_4_ + pfVar33[1];
            auVar116._8_4_ = auVar81._8_4_ + pfVar33[2];
            auVar116._12_4_ = auVar81._12_4_ + pfVar33[3];
            auVar116._16_4_ = auVar81._16_4_ + pfVar33[4];
            auVar116._20_4_ = auVar81._20_4_ + pfVar33[5];
            auVar116._24_4_ = auVar81._24_4_ + pfVar33[6];
            auVar116._28_4_ = auVar81._28_4_ + pfVar33[7];
            *pauVar32 = auVar116;
            pfVar33 = pfVar33 + 8;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar60._0_4_ = auVar55._0_4_ + *pfVar33;
            auVar60._4_4_ = auVar55._4_4_ + pfVar33[1];
            auVar60._8_4_ = auVar55._8_4_ + pfVar33[2];
            auVar60._12_4_ = auVar55._12_4_ + pfVar33[3];
            *(undefined1 (*) [16])*pauVar32 = auVar60;
            pfVar33 = pfVar33 + 4;
            pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            *(float *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 fVar45 + *(float *)((long)pvVar31 + lVar44 * 4 + sVar2 * (long)pvVar36 * lVar41);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_003710a4:
            auVar100._16_16_ = auVar55;
            auVar100._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_003710a4;
            auVar100 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pfVar33 = (float *)(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar118._0_4_ = auVar100._0_4_ + *pfVar33;
            auVar118._4_4_ = auVar100._4_4_ + pfVar33[1];
            auVar118._8_4_ = auVar100._8_4_ + pfVar33[2];
            auVar118._12_4_ = auVar100._12_4_ + pfVar33[3];
            auVar118._16_4_ = auVar100._16_4_ + pfVar33[4];
            auVar118._20_4_ = auVar100._20_4_ + pfVar33[5];
            auVar118._24_4_ = auVar100._24_4_ + pfVar33[6];
            auVar118._28_4_ = auVar100._28_4_ + pfVar33[7];
            *pauVar32 = auVar118;
            pfVar33 = pfVar33 + 8;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar68._0_4_ = auVar55._0_4_ + *pfVar33;
            auVar68._4_4_ = auVar55._4_4_ + pfVar33[1];
            auVar68._8_4_ = auVar55._8_4_ + pfVar33[2];
            auVar68._12_4_ = auVar55._12_4_ + pfVar33[3];
            *(undefined1 (*) [16])*pauVar32 = auVar68;
            pfVar33 = pfVar33 + 4;
            pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            *(float *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 fVar45 + *(float *)((long)pvVar31 + lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_003713cd:
              auVar102._16_16_ = auVar55;
              auVar102._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_003713cd;
              auVar102 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar119._0_4_ = auVar102._0_4_ + *pfVar33;
              auVar119._4_4_ = auVar102._4_4_ + pfVar33[1];
              auVar119._8_4_ = auVar102._8_4_ + pfVar33[2];
              auVar119._12_4_ = auVar102._12_4_ + pfVar33[3];
              auVar119._16_4_ = auVar102._16_4_ + pfVar33[4];
              auVar119._20_4_ = auVar102._20_4_ + pfVar33[5];
              auVar119._24_4_ = auVar102._24_4_ + pfVar33[6];
              auVar119._28_4_ = auVar102._28_4_ + pfVar33[7];
              *pauVar32 = auVar119;
              pfVar33 = pfVar33 + 8;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar69._0_4_ = auVar55._0_4_ + *pfVar33;
              auVar69._4_4_ = auVar55._4_4_ + pfVar33[1];
              auVar69._8_4_ = auVar55._8_4_ + pfVar33[2];
              auVar69._12_4_ = auVar55._12_4_ + pfVar33[3];
              *(undefined1 (*) [16])*pauVar32 = auVar69;
              pfVar33 = pfVar33 + 4;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 + *pfVar33;
              pfVar33 = pfVar33 + 1;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_0037166a:
              auVar104._16_16_ = auVar55;
              auVar104._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_0037166a;
              auVar104 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar120._0_4_ = auVar104._0_4_ + *pfVar33;
              auVar120._4_4_ = auVar104._4_4_ + pfVar33[1];
              auVar120._8_4_ = auVar104._8_4_ + pfVar33[2];
              auVar120._12_4_ = auVar104._12_4_ + pfVar33[3];
              auVar120._16_4_ = auVar104._16_4_ + pfVar33[4];
              auVar120._20_4_ = auVar104._20_4_ + pfVar33[5];
              auVar120._24_4_ = auVar104._24_4_ + pfVar33[6];
              auVar120._28_4_ = auVar104._28_4_ + pfVar33[7];
              *pauVar32 = auVar120;
              pfVar33 = pfVar33 + 8;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar70._0_4_ = auVar55._0_4_ + *pfVar33;
              auVar70._4_4_ = auVar55._4_4_ + pfVar33[1];
              auVar70._8_4_ = auVar55._8_4_ + pfVar33[2];
              auVar70._12_4_ = auVar55._12_4_ + pfVar33[3];
              *(undefined1 (*) [16])*pauVar32 = auVar70;
              pfVar33 = pfVar33 + 4;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 + *pfVar33;
              pfVar33 = pfVar33 + 1;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              fVar45 = *(float *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_00371937:
                auVar106._16_16_ = auVar55;
                auVar106._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
                if (iVar27 != 8) goto LAB_00371937;
                auVar106 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar121._0_4_ = auVar106._0_4_ + *pfVar33;
                auVar121._4_4_ = auVar106._4_4_ + pfVar33[1];
                auVar121._8_4_ = auVar106._8_4_ + pfVar33[2];
                auVar121._12_4_ = auVar106._12_4_ + pfVar33[3];
                auVar121._16_4_ = auVar106._16_4_ + pfVar33[4];
                auVar121._20_4_ = auVar106._20_4_ + pfVar33[5];
                auVar121._24_4_ = auVar106._24_4_ + pfVar33[6];
                auVar121._28_4_ = auVar106._28_4_ + pfVar33[7];
                *pauVar32 = auVar121;
                pfVar33 = pfVar33 + 8;
                pauVar32 = pauVar32 + 1;
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar71._0_4_ = auVar55._0_4_ + *pfVar33;
                auVar71._4_4_ = auVar55._4_4_ + pfVar33[1];
                auVar71._8_4_ = auVar55._8_4_ + pfVar33[2];
                auVar71._12_4_ = auVar55._12_4_ + pfVar33[3];
                *(undefined1 (*) [16])*pauVar32 = auVar71;
                pfVar33 = pfVar33 + 4;
                pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                *(float *)*pauVar32 = fVar45 + *pfVar33;
                pfVar33 = pfVar33 + 1;
                pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
              }
            }
          }
        }
      }
      break;
    case 1:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036f06b:
            auVar85._16_16_ = auVar55;
            auVar85._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036f06b;
            auVar85 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pauVar37 = (undefined1 (*) [32])((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vsubps_avx(*pauVar37,auVar85);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar56 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar55);
            *(undefined1 (*) [16])*pauVar32 = auVar56;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            *(float *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 *(float *)((long)pvVar31 + lVar44 * 4 + sVar2 * (long)pvVar36 * lVar41) - fVar45;
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0037120e:
            auVar101._16_16_ = auVar55;
            auVar101._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0037120e;
            auVar101 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pauVar37 = (undefined1 (*) [32])(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vsubps_avx(*pauVar37,auVar101);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar56 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar55);
            *(undefined1 (*) [16])*pauVar32 = auVar56;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            *(float *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 *(float *)((long)pvVar31 + lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36) - fVar45;
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00371513:
              auVar103._16_16_ = auVar55;
              auVar103._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_00371513;
              auVar103 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vsubps_avx(*pauVar37,auVar103);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar55);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = *(float *)*pauVar37 - fVar45;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_003717b5:
              auVar105._16_16_ = auVar55;
              auVar105._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_003717b5;
              auVar105 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vsubps_avx(*pauVar37,auVar105);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar55);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = *(float *)*pauVar37 - fVar45;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pauVar32 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize + (long)local_1c0->data
                     );
          pauVar37 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              fVar45 = *(float *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_00371aa7:
                auVar107._16_16_ = auVar55;
                auVar107._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
                if (iVar27 != 8) goto LAB_00371aa7;
                auVar107 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar87 = vsubps_avx(*pauVar32,auVar107);
                *pauVar37 = auVar87;
                pauVar32 = pauVar32 + 1;
                pauVar37 = pauVar37 + 1;
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar56 = vsubps_avx(*(undefined1 (*) [16])*pauVar32,auVar55);
                *(undefined1 (*) [16])*pauVar37 = auVar56;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                *(float *)*pauVar37 = *(float *)*pauVar32 - fVar45;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              }
            }
          }
        }
      }
      break;
    case 2:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036ebbe:
            auVar83._16_16_ = auVar55;
            auVar83._0_16_ = auVar55;
            auVar80 = auVar83._0_28_;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036ebbe;
            auVar80 = SUB3228(*(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20),0);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pfVar33 = (float *)((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar126._0_4_ = auVar80._0_4_ * *pfVar33;
            auVar126._4_4_ = auVar80._4_4_ * pfVar33[1];
            auVar126._8_4_ = auVar80._8_4_ * pfVar33[2];
            auVar126._12_4_ = auVar80._12_4_ * pfVar33[3];
            auVar126._16_4_ = auVar80._16_4_ * pfVar33[4];
            auVar126._20_4_ = auVar80._20_4_ * pfVar33[5];
            auVar126._28_36_ = in_ZMM3._28_36_;
            auVar126._24_4_ = auVar80._24_4_ * pfVar33[6];
            in_ZMM3 = ZEXT3264(auVar126._0_32_);
            *pauVar32 = auVar126._0_32_;
            pfVar33 = pfVar33 + 8;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar61._0_4_ = auVar55._0_4_ * *pfVar33;
            auVar61._4_4_ = auVar55._4_4_ * pfVar33[1];
            auVar61._8_4_ = auVar55._8_4_ * pfVar33[2];
            auVar61._12_4_ = auVar55._12_4_ * pfVar33[3];
            *(undefined1 (*) [16])*pauVar32 = auVar61;
            pfVar33 = pfVar33 + 4;
            pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            *(float *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 fVar45 * *(float *)((long)pvVar31 + lVar44 * 4 + sVar2 * (long)pvVar36 * lVar41);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036ff45:
            auVar92._16_16_ = auVar55;
            auVar92._0_16_ = auVar55;
            auVar80 = auVar92._0_28_;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036ff45;
            auVar80 = SUB3228(*(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20),0);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pfVar33 = (float *)(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar127._0_4_ = auVar80._0_4_ * *pfVar33;
            auVar127._4_4_ = auVar80._4_4_ * pfVar33[1];
            auVar127._8_4_ = auVar80._8_4_ * pfVar33[2];
            auVar127._12_4_ = auVar80._12_4_ * pfVar33[3];
            auVar127._16_4_ = auVar80._16_4_ * pfVar33[4];
            auVar127._20_4_ = auVar80._20_4_ * pfVar33[5];
            auVar127._28_36_ = in_ZMM3._28_36_;
            auVar127._24_4_ = auVar80._24_4_ * pfVar33[6];
            in_ZMM3 = ZEXT3264(auVar127._0_32_);
            *pauVar32 = auVar127._0_32_;
            pfVar33 = pfVar33 + 8;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar64._0_4_ = auVar55._0_4_ * *pfVar33;
            auVar64._4_4_ = auVar55._4_4_ * pfVar33[1];
            auVar64._8_4_ = auVar55._8_4_ * pfVar33[2];
            auVar64._12_4_ = auVar55._12_4_ * pfVar33[3];
            *(undefined1 (*) [16])*pauVar32 = auVar64;
            pfVar33 = pfVar33 + 4;
            pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            *(float *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 fVar45 * *(float *)((long)pvVar31 + lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_003700f8:
              auVar93._16_16_ = auVar55;
              auVar93._0_16_ = auVar55;
              auVar80 = auVar93._0_28_;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_003700f8;
              auVar80 = SUB3228(*(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41),0);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar128._0_4_ = auVar80._0_4_ * *pfVar33;
              auVar128._4_4_ = auVar80._4_4_ * pfVar33[1];
              auVar128._8_4_ = auVar80._8_4_ * pfVar33[2];
              auVar128._12_4_ = auVar80._12_4_ * pfVar33[3];
              auVar128._16_4_ = auVar80._16_4_ * pfVar33[4];
              auVar128._20_4_ = auVar80._20_4_ * pfVar33[5];
              auVar128._28_36_ = in_ZMM3._28_36_;
              auVar128._24_4_ = auVar80._24_4_ * pfVar33[6];
              in_ZMM3 = ZEXT3264(auVar128._0_32_);
              *pauVar32 = auVar128._0_32_;
              pfVar33 = pfVar33 + 8;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar65._0_4_ = auVar55._0_4_ * *pfVar33;
              auVar65._4_4_ = auVar55._4_4_ * pfVar33[1];
              auVar65._8_4_ = auVar55._8_4_ * pfVar33[2];
              auVar65._12_4_ = auVar55._12_4_ * pfVar33[3];
              *(undefined1 (*) [16])*pauVar32 = auVar65;
              pfVar33 = pfVar33 + 4;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 * *pfVar33;
              pfVar33 = pfVar33 + 1;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00370243:
              auVar94._16_16_ = auVar55;
              auVar94._0_16_ = auVar55;
              auVar80 = auVar94._0_28_;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_00370243;
              auVar80 = SUB3228(*(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41),0);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar129._0_4_ = auVar80._0_4_ * *pfVar33;
              auVar129._4_4_ = auVar80._4_4_ * pfVar33[1];
              auVar129._8_4_ = auVar80._8_4_ * pfVar33[2];
              auVar129._12_4_ = auVar80._12_4_ * pfVar33[3];
              auVar129._16_4_ = auVar80._16_4_ * pfVar33[4];
              auVar129._20_4_ = auVar80._20_4_ * pfVar33[5];
              auVar129._28_36_ = in_ZMM3._28_36_;
              auVar129._24_4_ = auVar80._24_4_ * pfVar33[6];
              in_ZMM3 = ZEXT3264(auVar129._0_32_);
              *pauVar32 = auVar129._0_32_;
              pfVar33 = pfVar33 + 8;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar66._0_4_ = auVar55._0_4_ * *pfVar33;
              auVar66._4_4_ = auVar55._4_4_ * pfVar33[1];
              auVar66._8_4_ = auVar55._8_4_ * pfVar33[2];
              auVar66._12_4_ = auVar55._12_4_ * pfVar33[3];
              *(undefined1 (*) [16])*pauVar32 = auVar66;
              pfVar33 = pfVar33 + 4;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 * *pfVar33;
              pfVar33 = pfVar33 + 1;
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              fVar45 = *(float *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_003703b9:
                auVar95._16_16_ = auVar55;
                auVar95._0_16_ = auVar55;
                auVar80 = auVar95._0_28_;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
                if (iVar27 != 8) goto LAB_003703b9;
                auVar80 = SUB3228(*(undefined1 (*) [32])
                                   ((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41),0);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar130._0_4_ = auVar80._0_4_ * *pfVar33;
                auVar130._4_4_ = auVar80._4_4_ * pfVar33[1];
                auVar130._8_4_ = auVar80._8_4_ * pfVar33[2];
                auVar130._12_4_ = auVar80._12_4_ * pfVar33[3];
                auVar130._16_4_ = auVar80._16_4_ * pfVar33[4];
                auVar130._20_4_ = auVar80._20_4_ * pfVar33[5];
                auVar130._28_36_ = in_ZMM3._28_36_;
                auVar130._24_4_ = auVar80._24_4_ * pfVar33[6];
                in_ZMM3 = ZEXT3264(auVar130._0_32_);
                *pauVar32 = auVar130._0_32_;
                pfVar33 = pfVar33 + 8;
                pauVar32 = pauVar32 + 1;
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar67._0_4_ = auVar55._0_4_ * *pfVar33;
                auVar67._4_4_ = auVar55._4_4_ * pfVar33[1];
                auVar67._8_4_ = auVar55._8_4_ * pfVar33[2];
                auVar67._12_4_ = auVar55._12_4_ * pfVar33[3];
                *(undefined1 (*) [16])*pauVar32 = auVar67;
                pfVar33 = pfVar33 + 4;
                pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                *(float *)*pauVar32 = fVar45 * *pfVar33;
                pfVar33 = pfVar33 + 1;
                pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
              }
            }
          }
        }
      }
      break;
    case 3:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        auVar46._8_4_ = 0x3f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        auVar46._12_4_ = 0x3f800000;
        auVar46._16_4_ = 0x3f800000;
        auVar46._20_4_ = 0x3f800000;
        auVar46._24_4_ = 0x3f800000;
        auVar46._28_4_ = 0x3f800000;
        auVar55._8_4_ = 0x3f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar55._12_4_ = 0x3f800000;
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar56 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036ed4f:
            auVar145._16_16_ = auVar56;
            auVar145._0_16_ = auVar56;
          }
          else {
            auVar56 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036ed4f;
            auVar145 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pfVar33 = (float *)((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          auVar87 = vrcpps_avx(auVar145);
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          fVar131 = auVar87._0_4_;
          fVar137 = auVar87._4_4_;
          auVar8._4_4_ = auVar145._4_4_ * fVar137;
          auVar8._0_4_ = auVar145._0_4_ * fVar131;
          fVar138 = auVar87._8_4_;
          auVar8._8_4_ = auVar145._8_4_ * fVar138;
          fVar139 = auVar87._12_4_;
          auVar8._12_4_ = auVar145._12_4_ * fVar139;
          fVar5 = auVar87._16_4_;
          auVar8._16_4_ = auVar145._16_4_ * fVar5;
          fVar6 = auVar87._20_4_;
          auVar8._20_4_ = auVar145._20_4_ * fVar6;
          fVar7 = auVar87._24_4_;
          auVar8._24_4_ = auVar145._24_4_ * fVar7;
          auVar8._28_4_ = auVar145._28_4_;
          auVar112 = vsubps_avx(auVar46,auVar8);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar18._4_4_ = (fVar137 + fVar137 * auVar112._4_4_) * pfVar33[1];
            auVar18._0_4_ = (fVar131 + fVar131 * auVar112._0_4_) * *pfVar33;
            auVar18._8_4_ = (fVar138 + fVar138 * auVar112._8_4_) * pfVar33[2];
            auVar18._12_4_ = (fVar139 + fVar139 * auVar112._12_4_) * pfVar33[3];
            auVar18._16_4_ = (fVar5 + fVar5 * auVar112._16_4_) * pfVar33[4];
            auVar18._20_4_ = (fVar6 + fVar6 * auVar112._20_4_) * pfVar33[5];
            auVar18._24_4_ = (fVar7 + fVar7 * auVar112._24_4_) * pfVar33[6];
            auVar18._28_4_ = auVar87._28_4_;
            *pauVar32 = auVar18;
            pfVar33 = pfVar33 + 8;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
            auVar87 = auVar18;
          }
          auVar140 = vrcpps_avx(auVar56);
          fVar131 = auVar140._0_4_;
          auVar132._0_4_ = auVar56._0_4_ * fVar131;
          fVar137 = auVar140._4_4_;
          auVar132._4_4_ = auVar56._4_4_ * fVar137;
          fVar138 = auVar140._8_4_;
          auVar132._8_4_ = auVar56._8_4_ * fVar138;
          fVar139 = auVar140._12_4_;
          auVar132._12_4_ = auVar56._12_4_ * fVar139;
          auVar56 = vsubps_avx(auVar55,auVar132);
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar140._0_4_ = (fVar131 + fVar131 * auVar56._0_4_) * *pfVar33;
            auVar140._4_4_ = (fVar137 + fVar137 * auVar56._4_4_) * pfVar33[1];
            auVar140._8_4_ = (fVar138 + fVar138 * auVar56._8_4_) * pfVar33[2];
            auVar140._12_4_ = (fVar139 + fVar139 * auVar56._12_4_) * pfVar33[3];
            *(undefined1 (*) [16])*pauVar32 = auVar140;
            pfVar33 = pfVar33 + 4;
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            *(float *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 (1.0 / fVar45) *
                 *(float *)((long)pvVar31 + lVar44 * 4 + sVar2 * (long)pvVar36 * lVar41);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar47._16_4_ = 0x3f800000;
        auVar47._20_4_ = 0x3f800000;
        auVar47._24_4_ = 0x3f800000;
        auVar47._28_4_ = 0x3f800000;
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_003704ca:
            auVar146._16_16_ = auVar55;
            auVar146._0_16_ = auVar55;
          }
          else {
            auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_003704ca;
            auVar146 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pfVar33 = (float *)(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          auVar87 = vrcpps_avx(auVar146);
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          fVar131 = auVar87._0_4_;
          fVar137 = auVar87._4_4_;
          auVar10._4_4_ = auVar146._4_4_ * fVar137;
          auVar10._0_4_ = auVar146._0_4_ * fVar131;
          fVar138 = auVar87._8_4_;
          auVar10._8_4_ = auVar146._8_4_ * fVar138;
          fVar139 = auVar87._12_4_;
          auVar10._12_4_ = auVar146._12_4_ * fVar139;
          fVar5 = auVar87._16_4_;
          auVar10._16_4_ = auVar146._16_4_ * fVar5;
          fVar6 = auVar87._20_4_;
          auVar10._20_4_ = auVar146._20_4_ * fVar6;
          fVar7 = auVar87._24_4_;
          auVar10._24_4_ = auVar146._24_4_ * fVar7;
          auVar10._28_4_ = auVar146._28_4_;
          auVar112 = vsubps_avx(auVar47,auVar10);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar19._4_4_ = (fVar137 + fVar137 * auVar112._4_4_) * pfVar33[1];
            auVar19._0_4_ = (fVar131 + fVar131 * auVar112._0_4_) * *pfVar33;
            auVar19._8_4_ = (fVar138 + fVar138 * auVar112._8_4_) * pfVar33[2];
            auVar19._12_4_ = (fVar139 + fVar139 * auVar112._12_4_) * pfVar33[3];
            auVar19._16_4_ = (fVar5 + fVar5 * auVar112._16_4_) * pfVar33[4];
            auVar19._20_4_ = (fVar6 + fVar6 * auVar112._20_4_) * pfVar33[5];
            auVar19._24_4_ = (fVar7 + fVar7 * auVar112._24_4_) * pfVar33[6];
            auVar19._28_4_ = auVar87._28_4_;
            *pauVar32 = auVar19;
            pfVar33 = pfVar33 + 8;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
            auVar87 = auVar19;
          }
          auVar140 = vrcpps_avx(auVar55);
          fVar131 = auVar140._0_4_;
          auVar133._0_4_ = auVar55._0_4_ * fVar131;
          fVar137 = auVar140._4_4_;
          auVar133._4_4_ = auVar55._4_4_ * fVar137;
          fVar138 = auVar140._8_4_;
          auVar133._8_4_ = auVar55._8_4_ * fVar138;
          fVar139 = auVar140._12_4_;
          auVar133._12_4_ = auVar55._12_4_ * fVar139;
          auVar55 = vsubps_avx(auVar56,auVar133);
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar141._0_4_ = (fVar131 + fVar131 * auVar55._0_4_) * *pfVar33;
            auVar141._4_4_ = (fVar137 + fVar137 * auVar55._4_4_) * pfVar33[1];
            auVar141._8_4_ = (fVar138 + fVar138 * auVar55._8_4_) * pfVar33[2];
            auVar141._12_4_ = (fVar139 + fVar139 * auVar55._12_4_) * pfVar33[3];
            *(undefined1 (*) [16])*pauVar32 = auVar141;
            pfVar33 = pfVar33 + 4;
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            *(float *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 (1.0 / fVar45) *
                 *(float *)((long)pvVar31 + lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar48._16_4_ = 0x3f800000;
        auVar48._20_4_ = 0x3f800000;
        auVar48._24_4_ = 0x3f800000;
        auVar48._28_4_ = 0x3f800000;
        auVar57._8_4_ = 0x3f800000;
        auVar57._0_8_ = 0x3f8000003f800000;
        auVar57._12_4_ = 0x3f800000;
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_003706c3:
              auVar147._16_16_ = auVar55;
              auVar147._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_003706c3;
              auVar147 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            auVar87 = vrcpps_avx(auVar147);
            fVar131 = auVar87._0_4_;
            fVar137 = auVar87._4_4_;
            auVar11._4_4_ = auVar147._4_4_ * fVar137;
            auVar11._0_4_ = auVar147._0_4_ * fVar131;
            fVar138 = auVar87._8_4_;
            auVar11._8_4_ = auVar147._8_4_ * fVar138;
            fVar139 = auVar87._12_4_;
            auVar11._12_4_ = auVar147._12_4_ * fVar139;
            fVar5 = auVar87._16_4_;
            auVar11._16_4_ = auVar147._16_4_ * fVar5;
            fVar6 = auVar87._20_4_;
            auVar11._20_4_ = auVar147._20_4_ * fVar6;
            fVar7 = auVar87._24_4_;
            auVar11._24_4_ = auVar147._24_4_ * fVar7;
            auVar11._28_4_ = auVar147._28_4_;
            auVar112 = vsubps_avx(auVar48,auVar11);
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar20._4_4_ = (fVar137 + fVar137 * auVar112._4_4_) * pfVar33[1];
              auVar20._0_4_ = (fVar131 + fVar131 * auVar112._0_4_) * *pfVar33;
              auVar20._8_4_ = (fVar138 + fVar138 * auVar112._8_4_) * pfVar33[2];
              auVar20._12_4_ = (fVar139 + fVar139 * auVar112._12_4_) * pfVar33[3];
              auVar20._16_4_ = (fVar5 + fVar5 * auVar112._16_4_) * pfVar33[4];
              auVar20._20_4_ = (fVar6 + fVar6 * auVar112._20_4_) * pfVar33[5];
              auVar20._24_4_ = (fVar7 + fVar7 * auVar112._24_4_) * pfVar33[6];
              auVar20._28_4_ = auVar87._28_4_;
              *pauVar32 = auVar20;
              pfVar33 = pfVar33 + 8;
              pauVar32 = pauVar32 + 1;
              auVar87 = auVar20;
            }
            auVar56 = vrcpps_avx(auVar55);
            fVar131 = auVar56._0_4_;
            auVar134._0_4_ = auVar55._0_4_ * fVar131;
            fVar137 = auVar56._4_4_;
            auVar134._4_4_ = auVar55._4_4_ * fVar137;
            fVar138 = auVar56._8_4_;
            auVar134._8_4_ = auVar55._8_4_ * fVar138;
            fVar139 = auVar56._12_4_;
            auVar134._12_4_ = auVar55._12_4_ * fVar139;
            auVar55 = vsubps_avx(auVar57,auVar134);
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar142._0_4_ = (fVar131 + fVar131 * auVar55._0_4_) * *pfVar33;
              auVar142._4_4_ = (fVar137 + fVar137 * auVar55._4_4_) * pfVar33[1];
              auVar142._8_4_ = (fVar138 + fVar138 * auVar55._8_4_) * pfVar33[2];
              auVar142._12_4_ = (fVar139 + fVar139 * auVar55._12_4_) * pfVar33[3];
              *(undefined1 (*) [16])*pauVar32 = auVar142;
              pfVar33 = pfVar33 + 4;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = (1.0 / fVar45) * *pfVar33;
              pfVar33 = pfVar33 + 1;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar49._16_4_ = 0x3f800000;
        auVar49._20_4_ = 0x3f800000;
        auVar49._24_4_ = 0x3f800000;
        auVar49._28_4_ = 0x3f800000;
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = 0x3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00370856:
              auVar148._16_16_ = auVar55;
              auVar148._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_00370856;
              auVar148 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            auVar87 = vrcpps_avx(auVar148);
            fVar131 = auVar87._0_4_;
            fVar137 = auVar87._4_4_;
            auVar12._4_4_ = auVar148._4_4_ * fVar137;
            auVar12._0_4_ = auVar148._0_4_ * fVar131;
            fVar138 = auVar87._8_4_;
            auVar12._8_4_ = auVar148._8_4_ * fVar138;
            fVar139 = auVar87._12_4_;
            auVar12._12_4_ = auVar148._12_4_ * fVar139;
            fVar5 = auVar87._16_4_;
            auVar12._16_4_ = auVar148._16_4_ * fVar5;
            fVar6 = auVar87._20_4_;
            auVar12._20_4_ = auVar148._20_4_ * fVar6;
            fVar7 = auVar87._24_4_;
            auVar12._24_4_ = auVar148._24_4_ * fVar7;
            auVar12._28_4_ = auVar148._28_4_;
            auVar112 = vsubps_avx(auVar49,auVar12);
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar21._4_4_ = (fVar137 + fVar137 * auVar112._4_4_) * pfVar33[1];
              auVar21._0_4_ = (fVar131 + fVar131 * auVar112._0_4_) * *pfVar33;
              auVar21._8_4_ = (fVar138 + fVar138 * auVar112._8_4_) * pfVar33[2];
              auVar21._12_4_ = (fVar139 + fVar139 * auVar112._12_4_) * pfVar33[3];
              auVar21._16_4_ = (fVar5 + fVar5 * auVar112._16_4_) * pfVar33[4];
              auVar21._20_4_ = (fVar6 + fVar6 * auVar112._20_4_) * pfVar33[5];
              auVar21._24_4_ = (fVar7 + fVar7 * auVar112._24_4_) * pfVar33[6];
              auVar21._28_4_ = auVar87._28_4_;
              *pauVar32 = auVar21;
              pfVar33 = pfVar33 + 8;
              pauVar32 = pauVar32 + 1;
              auVar87 = auVar21;
            }
            auVar56 = vrcpps_avx(auVar55);
            fVar131 = auVar56._0_4_;
            auVar135._0_4_ = auVar55._0_4_ * fVar131;
            fVar137 = auVar56._4_4_;
            auVar135._4_4_ = auVar55._4_4_ * fVar137;
            fVar138 = auVar56._8_4_;
            auVar135._8_4_ = auVar55._8_4_ * fVar138;
            fVar139 = auVar56._12_4_;
            auVar135._12_4_ = auVar55._12_4_ * fVar139;
            auVar55 = vsubps_avx(auVar58,auVar135);
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar143._0_4_ = (fVar131 + fVar131 * auVar55._0_4_) * *pfVar33;
              auVar143._4_4_ = (fVar137 + fVar137 * auVar55._4_4_) * pfVar33[1];
              auVar143._8_4_ = (fVar138 + fVar138 * auVar55._8_4_) * pfVar33[2];
              auVar143._12_4_ = (fVar139 + fVar139 * auVar55._12_4_) * pfVar33[3];
              *(undefined1 (*) [16])*pauVar32 = auVar143;
              pfVar33 = pfVar33 + 4;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = (1.0 / fVar45) * *pfVar33;
              pfVar33 = pfVar33 + 1;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        auVar50._8_4_ = 0x3f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        auVar50._12_4_ = 0x3f800000;
        auVar50._16_4_ = 0x3f800000;
        auVar50._20_4_ = 0x3f800000;
        auVar50._24_4_ = 0x3f800000;
        auVar50._28_4_ = 0x3f800000;
        auVar59._8_4_ = 0x3f800000;
        auVar59._0_8_ = 0x3f8000003f800000;
        auVar59._12_4_ = 0x3f800000;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              fVar45 = *(float *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_00370a14:
                auVar149._16_16_ = auVar55;
                auVar149._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
                if (iVar27 != 8) goto LAB_00370a14;
                auVar149 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              auVar87 = vrcpps_avx(auVar149);
              fVar131 = auVar87._0_4_;
              fVar137 = auVar87._4_4_;
              auVar13._4_4_ = auVar149._4_4_ * fVar137;
              auVar13._0_4_ = auVar149._0_4_ * fVar131;
              fVar138 = auVar87._8_4_;
              auVar13._8_4_ = auVar149._8_4_ * fVar138;
              fVar139 = auVar87._12_4_;
              auVar13._12_4_ = auVar149._12_4_ * fVar139;
              fVar5 = auVar87._16_4_;
              auVar13._16_4_ = auVar149._16_4_ * fVar5;
              fVar6 = auVar87._20_4_;
              auVar13._20_4_ = auVar149._20_4_ * fVar6;
              fVar7 = auVar87._24_4_;
              auVar13._24_4_ = auVar149._24_4_ * fVar7;
              auVar13._28_4_ = auVar149._28_4_;
              auVar112 = vsubps_avx(auVar50,auVar13);
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar22._4_4_ = (fVar137 + fVar137 * auVar112._4_4_) * pfVar33[1];
                auVar22._0_4_ = (fVar131 + fVar131 * auVar112._0_4_) * *pfVar33;
                auVar22._8_4_ = (fVar138 + fVar138 * auVar112._8_4_) * pfVar33[2];
                auVar22._12_4_ = (fVar139 + fVar139 * auVar112._12_4_) * pfVar33[3];
                auVar22._16_4_ = (fVar5 + fVar5 * auVar112._16_4_) * pfVar33[4];
                auVar22._20_4_ = (fVar6 + fVar6 * auVar112._20_4_) * pfVar33[5];
                auVar22._24_4_ = (fVar7 + fVar7 * auVar112._24_4_) * pfVar33[6];
                auVar22._28_4_ = auVar87._28_4_;
                *pauVar32 = auVar22;
                pfVar33 = pfVar33 + 8;
                pauVar32 = pauVar32 + 1;
                auVar87 = auVar22;
              }
              auVar56 = vrcpps_avx(auVar55);
              fVar131 = auVar56._0_4_;
              auVar136._0_4_ = auVar55._0_4_ * fVar131;
              fVar137 = auVar56._4_4_;
              auVar136._4_4_ = auVar55._4_4_ * fVar137;
              fVar138 = auVar56._8_4_;
              auVar136._8_4_ = auVar55._8_4_ * fVar138;
              fVar139 = auVar56._12_4_;
              auVar136._12_4_ = auVar55._12_4_ * fVar139;
              auVar55 = vsubps_avx(auVar59,auVar136);
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar144._0_4_ = (fVar131 + fVar131 * auVar55._0_4_) * *pfVar33;
                auVar144._4_4_ = (fVar137 + fVar137 * auVar55._4_4_) * pfVar33[1];
                auVar144._8_4_ = (fVar138 + fVar138 * auVar55._8_4_) * pfVar33[2];
                auVar144._12_4_ = (fVar139 + fVar139 * auVar55._12_4_) * pfVar33[3];
                *(undefined1 (*) [16])*pauVar32 = auVar144;
                pfVar33 = pfVar33 + 4;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                *(float *)*pauVar32 = (1.0 / fVar45) * *pfVar33;
                pfVar33 = pfVar33 + 1;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
              }
            }
          }
        }
      }
      break;
    case 4:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          auVar55 = ZEXT416(*(uint *)((long)pvVar25 + (long)pvVar36 * 4));
          if (iVar27 == 4) {
            auVar56 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036e7da:
            auVar82._16_16_ = auVar56;
            auVar82._0_16_ = auVar56;
          }
          else {
            auVar56 = vpshufd_avx(auVar55,0);
            if (iVar27 != 8) goto LAB_0036e7da;
            auVar82 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pauVar37 = (undefined1 (*) [32])((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vmaxps_avx(auVar82,*pauVar37);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar140 = vmaxps_avx(auVar56,*(undefined1 (*) [16])*pauVar37);
            *(undefined1 (*) [16])*pauVar32 = auVar140;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            auVar56 = vmaxss_avx(auVar55,ZEXT416(*(uint *)((long)pvVar31 +
                                                          lVar44 * 4 +
                                                          sVar2 * (long)pvVar36 * lVar41)));
            *(int *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 auVar56._0_4_;
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          auVar55 = ZEXT416(*(uint *)((long)pvVar25 + (long)pvVar36 * 4));
          if (iVar27 == 4) {
            auVar56 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036f9da:
            auVar88._16_16_ = auVar56;
            auVar88._0_16_ = auVar56;
          }
          else {
            auVar56 = vpshufd_avx(auVar55,0);
            if (iVar27 != 8) goto LAB_0036f9da;
            auVar88 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pauVar37 = (undefined1 (*) [32])(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vmaxps_avx(auVar88,*pauVar37);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar140 = vmaxps_avx(auVar56,*(undefined1 (*) [16])*pauVar37);
            *(undefined1 (*) [16])*pauVar32 = auVar140;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            auVar56 = vmaxss_avx(auVar55,ZEXT416(*(uint *)((long)pvVar31 +
                                                          lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36
                                                          )));
            *(int *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 auVar56._0_4_;
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            uVar1 = *(uint *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_0036fb8d:
              auVar89._16_16_ = auVar55;
              auVar89._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
              if (iVar27 != 8) goto LAB_0036fb8d;
              auVar89 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vmaxps_avx(auVar89,*pauVar37);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vmaxps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              auVar55 = vmaxss_avx(ZEXT416(uVar1),ZEXT416(*(uint *)*pauVar37));
              *(int *)*pauVar32 = auVar55._0_4_;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            uVar1 = *(uint *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_0036fcd8:
              auVar90._16_16_ = auVar55;
              auVar90._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
              if (iVar27 != 8) goto LAB_0036fcd8;
              auVar90 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vmaxps_avx(auVar90,*pauVar37);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vmaxps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              auVar55 = vmaxss_avx(ZEXT416(uVar1),ZEXT416(*(uint *)*pauVar37));
              *(int *)*pauVar32 = auVar55._0_4_;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pauVar32 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize + (long)local_1c0->data
                     );
          pauVar37 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              uVar24 = *(uint *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_0036fe4e:
                auVar91._16_16_ = auVar55;
                auVar91._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416(uVar24),ZEXT416(uVar24),0);
                if (iVar27 != 8) goto LAB_0036fe4e;
                auVar91 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar87 = vmaxps_avx(auVar91,*pauVar32);
                *pauVar37 = auVar87;
                pauVar32 = pauVar32 + 1;
                pauVar37 = pauVar37 + 1;
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar56 = vmaxps_avx(auVar55,*(undefined1 (*) [16])*pauVar32);
                *(undefined1 (*) [16])*pauVar37 = auVar56;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                auVar55 = vmaxss_avx(ZEXT416(uVar24),ZEXT416(*(uint *)*pauVar32));
                *(int *)*pauVar37 = auVar55._0_4_;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              }
            }
          }
        }
      }
      break;
    case 5:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          auVar55 = ZEXT416(*(uint *)((long)pvVar25 + (long)pvVar36 * 4));
          if (iVar27 == 4) {
            auVar56 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036f1ee:
            auVar86._16_16_ = auVar56;
            auVar86._0_16_ = auVar56;
          }
          else {
            auVar56 = vpshufd_avx(auVar55,0);
            if (iVar27 != 8) goto LAB_0036f1ee;
            auVar86 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pauVar37 = (undefined1 (*) [32])((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vminps_avx(auVar86,*pauVar37);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar140 = vminps_avx(auVar56,*(undefined1 (*) [16])*pauVar37);
            *(undefined1 (*) [16])*pauVar32 = auVar140;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            auVar56 = vminss_avx(auVar55,ZEXT416(*(uint *)((long)pvVar31 +
                                                          lVar44 * 4 +
                                                          sVar2 * (long)pvVar36 * lVar41)));
            *(int *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 auVar56._0_4_;
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          auVar55 = ZEXT416(*(uint *)((long)pvVar25 + (long)pvVar36 * 4));
          if (iVar27 == 4) {
            auVar56 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_00371baa:
            auVar108._16_16_ = auVar56;
            auVar108._0_16_ = auVar56;
          }
          else {
            auVar56 = vpshufd_avx(auVar55,0);
            if (iVar27 != 8) goto LAB_00371baa;
            auVar108 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pauVar37 = (undefined1 (*) [32])(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vminps_avx(auVar108,*pauVar37);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar140 = vminps_avx(auVar56,*(undefined1 (*) [16])*pauVar37);
            *(undefined1 (*) [16])*pauVar32 = auVar140;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            auVar56 = vminss_avx(auVar55,ZEXT416(*(uint *)((long)pvVar31 +
                                                          lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36
                                                          )));
            *(int *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 auVar56._0_4_;
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            uVar1 = *(uint *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00371d5d:
              auVar109._16_16_ = auVar55;
              auVar109._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
              if (iVar27 != 8) goto LAB_00371d5d;
              auVar109 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vminps_avx(auVar109,*pauVar37);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vminps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              auVar55 = vminss_avx(ZEXT416(uVar1),ZEXT416(*(uint *)*pauVar37));
              *(int *)*pauVar32 = auVar55._0_4_;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            uVar1 = *(uint *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00371ea8:
              auVar110._16_16_ = auVar55;
              auVar110._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
              if (iVar27 != 8) goto LAB_00371ea8;
              auVar110 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vminps_avx(auVar110,*pauVar37);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vminps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              auVar55 = vminss_avx(ZEXT416(uVar1),ZEXT416(*(uint *)*pauVar37));
              *(int *)*pauVar32 = auVar55._0_4_;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pauVar32 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize + (long)local_1c0->data
                     );
          pauVar37 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              uVar24 = *(uint *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_0037201e:
                auVar111._16_16_ = auVar55;
                auVar111._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416(uVar24),ZEXT416(uVar24),0);
                if (iVar27 != 8) goto LAB_0037201e;
                auVar111 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar87 = vminps_avx(auVar111,*pauVar32);
                *pauVar37 = auVar87;
                pauVar32 = pauVar32 + 1;
                pauVar37 = pauVar37 + 1;
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar56 = vminps_avx(auVar55,*(undefined1 (*) [16])*pauVar32);
                *(undefined1 (*) [16])*pauVar37 = auVar56;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                auVar55 = vminss_avx(ZEXT416(uVar24),ZEXT416(*(uint *)*pauVar32));
                *(int *)*pauVar37 = auVar55._0_4_;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              }
            }
          }
        }
      }
      break;
    case 6:
      local_160 = local_1c0->w;
      local_1a0 = (void *)(ulong)(uint)local_1c0->h;
      local_e8 = (void *)(ulong)(uint)local_1c0->d;
      local_f0 = (void *)(ulong)(uint)local_1c0->c;
      iVar23 = local_1c0->elempack;
      iVar27 = local_1c0->dims;
      local_104 = iVar23;
      if ((iVar27 == 2) && (iVar43 == 1)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < local_1c0->h) {
          local_b0 = local_1a0;
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_180 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036f3a4:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_180,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_0036f3a4;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)(long)local_1c0->w;
          local_110 = (void *)local_1c0->elemsize;
          local_130._0_8_ = local_1c0->data;
          pfVar33 = (float *)((long)pvVar36 * (long)local_140 * (long)local_110 +
                             (long)local_1c0->data);
          local_118 = (size_t)local_198->w;
          local_1b8 = local_198->data;
          local_a8 = local_198->elemsize;
          pfVar35 = (float *)((long)pvVar36 * local_118 * local_a8 + (long)local_1b8);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                      ((binary_op_pow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                 ((binary_op_pow *)&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_1b8 = (void *)((long)local_1b8 + local_a8 * (long)local_138 * local_118);
          local_130._0_8_ = local_130._0_8_ + (long)local_110 * (long)local_138 * (long)local_140;
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = powf(*(float *)(local_130._0_8_ + lVar41 * 4),local_180._0_4_);
            *(float *)((long)local_1b8 + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 - 3U < 2) && ((int)local_1a8 == 1)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0 * (int)local_e8;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_b0 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_180 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_00372c05:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_180,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_00372c05;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)local_1c0->cstep;
          local_110 = (void *)local_1c0->elemsize;
          local_130._0_8_ = local_1c0->data;
          pfVar33 = (float *)((long)local_140 * (long)pvVar36 * (long)local_110 +
                             (long)local_1c0->data);
          local_118 = local_198->cstep;
          local_1b8 = local_198->data;
          local_a8 = local_198->elemsize;
          pfVar35 = (float *)(local_118 * (long)pvVar36 * local_a8 + (long)local_1b8);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                      ((binary_op_pow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                 ((binary_op_pow *)&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_1b8 = (void *)((long)local_1b8 + local_118 * local_a8 * (long)local_138);
          local_130._0_8_ = local_130._0_8_ + (long)local_140 * (long)local_110 * (long)local_138;
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = powf(*(float *)(local_130._0_8_ + lVar41 * 4),local_180._0_4_);
            *(float *)((long)local_1b8 + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 3) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_1a0) {
          uVar26 = (ulong)local_1a0 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            uVar24 = *(uint *)((long)local_138 + (long)pvVar25 * 4);
            local_130 = ZEXT416(uVar24);
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_0037354c:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
              if (iVar23 != 8) goto LAB_0037354c;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                   ((binary_op_pow *)&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = powf(*pfVar35,local_130._0_4_);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_e8) {
          uVar26 = (ulong)local_e8 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            uVar24 = *(uint *)((long)local_138 + (long)pvVar25 * 4);
            local_130 = ZEXT416(uVar24);
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_00373dcb:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
              if (iVar23 != 8) goto LAB_00373dcb;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                   ((binary_op_pow *)&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = powf(*pfVar35,local_130._0_4_);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 3)) {
        local_160 = local_160 * iVar23;
        pvVar25 = (void *)0x0;
        iVar43 = (int)local_1a0;
        local_1a0 = (void *)((ulong)local_1a0 & 0xffffffff);
        if (iVar43 < 1) {
          local_1a0 = pvVar25;
        }
        iVar43 = (int)local_e8;
        local_e8 = (void *)((ulong)local_e8 & 0xffffffff);
        if (iVar43 < 1) {
          local_e8 = pvVar25;
        }
        iVar43 = (int)local_f0;
        local_f0 = (void *)((ulong)local_f0 & 0xffffffff);
        if (iVar43 < 1) {
          local_f0 = pvVar25;
        }
        local_148 = local_148 * local_168;
        local_168 = (long)local_1ac * local_168;
        while (pvVar25 != local_f0) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar25 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pfVar35 = (float *)(local_198->cstep * (long)pvVar25 * local_198->elemsize +
                             (long)local_198->data);
          local_1a8 = (void *)(local_148 * (long)pvVar25 + (long)local_1c8);
          pvVar36 = (void *)0x0;
          local_140 = pvVar25;
          while (pvVar36 != local_e8) {
            local_180._0_8_ = (void *)(local_168 * (long)pvVar36 + (long)local_1a8);
            pvVar25 = (void *)0x0;
            local_138 = pvVar36;
            while (pvVar25 != local_1a0) {
              uVar24 = *(uint *)(local_180._0_8_ + (long)pvVar25 * 4);
              local_130 = ZEXT416(uVar24);
              if (iVar23 == 4) {
                local_100 = *(__m128 *)(local_180._0_8_ + (long)pvVar25 * 0x10);
LAB_00374785:
                local_a0.elemsize._0_4_ = local_100[0];
                local_a0.elemsize._4_4_ = local_100[1];
                local_a0.elempack = local_100[2];
                local_a0._28_4_ = local_100[3];
                local_a0.data._0_4_ = local_100[0];
                local_a0.data._4_4_ = local_100[1];
                local_a0.refcount._0_4_ = local_100[2];
                local_a0.refcount._4_4_ = local_100[3];
              }
              else {
                local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
                if (iVar23 != 8) goto LAB_00374785;
                local_a0._0_32_ = *(undefined1 (*) [32])(local_180._0_8_ + (long)pvVar25 * 0x20);
              }
              local_1b8 = pvVar25;
              for (iVar43 = 0; iVar43 + 7 < (int)local_160; iVar43 = iVar43 + 8) {
                uVar52 = *(undefined8 *)pfVar33;
                uVar51 = *(undefined8 *)(pfVar33 + 2);
                uVar53 = *(undefined8 *)(pfVar33 + 4);
                uVar54 = *(undefined8 *)(pfVar33 + 6);
                local_e0 = (float  [2])uVar52;
                afStack_d8 = (float  [2])uVar51;
                afStack_d0 = (float  [2])uVar53;
                afStack_c8._0_8_ = uVar54;
                BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                          ((binary_op_pow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
                *(undefined8 *)pfVar35 = uVar52;
                *(undefined8 *)(pfVar35 + 2) = uVar51;
                *(undefined8 *)(pfVar35 + 4) = uVar53;
                *(undefined8 *)(pfVar35 + 6) = uVar54;
                pfVar33 = pfVar33 + 8;
                pfVar35 = pfVar35 + 8;
              }
              for (; iVar43 + 3 < (int)local_160; iVar43 = iVar43 + 4) {
                local_e0 = *(float (*) [2])pfVar33;
                uVar52 = *(undefined8 *)(pfVar33 + 2);
                afStack_d8 = (float  [2])uVar52;
                afVar155 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                     ((binary_op_pow *)&local_1c9,(__m128 *)local_e0,&local_100);
                *(long *)pfVar35 = afVar155._0_8_;
                *(undefined8 *)(pfVar35 + 2) = uVar52;
                pfVar33 = pfVar33 + 4;
                pfVar35 = pfVar35 + 4;
              }
              for (; iVar43 < (int)local_160; iVar43 = iVar43 + 1) {
                fVar45 = powf(*pfVar33,local_130._0_4_);
                *pfVar35 = fVar45;
                pfVar33 = pfVar33 + 1;
                pfVar35 = pfVar35 + 1;
              }
              iVar23 = local_104;
              pvVar25 = (void *)((long)local_1b8 + 1);
            }
            pvVar36 = (void *)((long)local_138 + 1);
          }
          pvVar25 = (void *)((long)local_140 + 1);
        }
      }
      break;
    case 7:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036eef4:
            auVar84._16_16_ = auVar55;
            auVar84._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036eef4;
            auVar84 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pauVar37 = (undefined1 (*) [32])((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vsubps_avx(auVar84,*pauVar37);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar56 = vsubps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
            *(undefined1 (*) [16])*pauVar32 = auVar56;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            *(float *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 fVar45 - *(float *)((long)pvVar31 + lVar44 * 4 + sVar2 * (long)pvVar36 * lVar41);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_00370b39:
            auVar96._16_16_ = auVar55;
            auVar96._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_00370b39;
            auVar96 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pauVar37 = (undefined1 (*) [32])(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = vsubps_avx(auVar96,*pauVar37);
            *pauVar32 = auVar87;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar56 = vsubps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
            *(undefined1 (*) [16])*pauVar32 = auVar56;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            *(float *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 fVar45 - *(float *)((long)pvVar31 + lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00370cec:
              auVar97._16_16_ = auVar55;
              auVar97._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_00370cec;
              auVar97 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vsubps_avx(auVar97,*pauVar37);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vsubps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 - *(float *)*pauVar37;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00370e37:
              auVar98._16_16_ = auVar55;
              auVar98._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_00370e37;
              auVar98 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = vsubps_avx(auVar98,*pauVar37);
              *pauVar32 = auVar87;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = vsubps_avx(auVar55,*(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar32 = auVar56;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 - *(float *)*pauVar37;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pauVar32 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize + (long)local_1c0->data
                     );
          pauVar37 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              fVar45 = *(float *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_00370fad:
                auVar99._16_16_ = auVar55;
                auVar99._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
                if (iVar27 != 8) goto LAB_00370fad;
                auVar99 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar87 = vsubps_avx(auVar99,*pauVar32);
                *pauVar37 = auVar87;
                pauVar32 = pauVar32 + 1;
                pauVar37 = pauVar37 + 1;
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar56 = vsubps_avx(auVar55,*(undefined1 (*) [16])*pauVar32);
                *(undefined1 (*) [16])*pauVar37 = auVar56;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                *(float *)*pauVar37 = fVar45 - *(float *)*pauVar32;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              }
            }
          }
        }
      }
      break;
    case 8:
      iVar23 = local_1c0->w;
      uVar24 = local_1c0->h;
      local_160 = local_1c0->d;
      uVar29 = local_1c0->c;
      local_180._0_8_ = CONCAT44(0,uVar29);
      iVar27 = local_1c0->elempack;
      iVar30 = local_1c0->dims;
      iStack_15c = 0;
      if ((iVar30 == 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar24) {
          local_1a0 = (void *)(ulong)uVar24;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036f5d5:
            auVar87._16_16_ = auVar55;
            auVar87._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_0036f5d5;
            auVar87 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          lVar41 = (long)local_1c0->w;
          local_130._0_8_ = lVar41;
          pvVar31 = local_1c0->data;
          sVar2 = local_1c0->elemsize;
          pauVar37 = (undefined1 (*) [32])((long)pvVar36 * lVar41 * sVar2 + (long)pvVar31);
          local_1b8 = (void *)(long)local_198->w;
          pvVar39 = local_198->data;
          sVar3 = local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])((long)pvVar36 * (long)local_1b8 * sVar3 + (long)pvVar39);
          lVar44 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar112 = *pauVar37;
            auVar113 = vrcpps_avx(auVar112);
            auVar150._0_4_ = auVar87._0_4_ * auVar113._0_4_;
            auVar150._4_4_ = auVar87._4_4_ * auVar113._4_4_;
            auVar150._8_4_ = auVar87._8_4_ * auVar113._8_4_;
            auVar150._12_4_ = auVar87._12_4_ * auVar113._12_4_;
            auVar150._16_4_ = auVar87._16_4_ * auVar113._16_4_;
            auVar150._20_4_ = auVar87._20_4_ * auVar113._20_4_;
            auVar150._28_36_ = in_ZMM5._28_36_;
            auVar150._24_4_ = auVar87._24_4_ * auVar113._24_4_;
            auVar9._4_4_ = auVar112._4_4_ * auVar150._4_4_;
            auVar9._0_4_ = auVar112._0_4_ * auVar150._0_4_;
            auVar9._8_4_ = auVar112._8_4_ * auVar150._8_4_;
            auVar9._12_4_ = auVar112._12_4_ * auVar150._12_4_;
            auVar9._16_4_ = auVar112._16_4_ * auVar150._16_4_;
            auVar9._20_4_ = auVar112._20_4_ * auVar150._20_4_;
            auVar9._24_4_ = auVar112._24_4_ * auVar150._24_4_;
            auVar9._28_4_ = auVar112._28_4_;
            auVar112 = vsubps_avx(auVar87,auVar9);
            auVar117._0_4_ = auVar150._0_4_ + auVar113._0_4_ * auVar112._0_4_;
            auVar117._4_4_ = auVar150._4_4_ + auVar113._4_4_ * auVar112._4_4_;
            auVar117._8_4_ = auVar150._8_4_ + auVar113._8_4_ * auVar112._8_4_;
            auVar117._12_4_ = auVar150._12_4_ + auVar113._12_4_ * auVar112._12_4_;
            auVar117._16_4_ = auVar150._16_4_ + auVar113._16_4_ * auVar112._16_4_;
            auVar117._20_4_ = auVar150._20_4_ + auVar113._20_4_ * auVar112._20_4_;
            auVar117._24_4_ = auVar150._24_4_ + auVar113._24_4_ * auVar112._24_4_;
            auVar117._28_4_ = in_ZMM5._28_4_ + auVar112._28_4_;
            *pauVar32 = auVar117;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar44 = lVar44 + 8;
            in_ZMM5 = ZEXT3264(auVar150._0_32_);
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar56 = *(undefined1 (*) [16])*pauVar37;
            auVar140 = vrcpps_avx(auVar56);
            fVar131 = auVar55._0_4_ * auVar140._0_4_;
            fVar137 = auVar55._4_4_ * auVar140._4_4_;
            fVar138 = auVar55._8_4_ * auVar140._8_4_;
            fVar139 = auVar55._12_4_ * auVar140._12_4_;
            auVar62._0_4_ = auVar56._0_4_ * fVar131;
            auVar62._4_4_ = auVar56._4_4_ * fVar137;
            auVar62._8_4_ = auVar56._8_4_ * fVar138;
            auVar62._12_4_ = auVar56._12_4_ * fVar139;
            auVar56 = vsubps_avx(auVar55,auVar62);
            auVar63._0_4_ = fVar131 + auVar140._0_4_ * auVar56._0_4_;
            auVar63._4_4_ = fVar137 + auVar140._4_4_ * auVar56._4_4_;
            auVar63._8_4_ = fVar138 + auVar140._8_4_ * auVar56._8_4_;
            auVar63._12_4_ = fVar139 + auVar140._12_4_ * auVar56._12_4_;
            *(undefined1 (*) [16])*pauVar32 = auVar63;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            lVar44 = lVar44 + 4;
          }
          for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
            *(float *)((long)pvVar39 + lVar44 * 4 + sVar3 * (long)pvVar36 * (long)local_1b8) =
                 fVar45 / *(float *)((long)pvVar31 + lVar44 * 4 + sVar2 * (long)pvVar36 * lVar41);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 - 3U < 2) && (iVar43 == 1)) {
        iVar30 = iVar27 * iVar23 * uVar24 * local_160;
        pvVar36 = (void *)0x0;
        local_1a0 = (void *)0x0;
        if (0 < (int)uVar29) {
          local_1a0 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != local_1a0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          fVar45 = *(float *)((long)pvVar25 + (long)pvVar36 * 4);
          if (iVar27 == 4) {
            auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_00372115:
            auVar112._16_16_ = auVar55;
            auVar112._0_16_ = auVar55;
          }
          else {
            auVar55 = vpshufd_avx(ZEXT416((uint)fVar45),0);
            if (iVar27 != 8) goto LAB_00372115;
            auVar112 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          sVar2 = local_1c0->cstep;
          pvVar31 = local_1c0->data;
          sVar3 = local_1c0->elemsize;
          local_130._0_8_ = sVar3;
          pauVar37 = (undefined1 (*) [32])(sVar2 * (long)pvVar36 * sVar3 + (long)pvVar31);
          sVar4 = local_198->cstep;
          pvVar39 = local_198->data;
          local_1b8 = (void *)local_198->elemsize;
          pauVar32 = (undefined1 (*) [32])(sVar4 * (long)pvVar36 * (long)local_1b8 + (long)pvVar39);
          lVar41 = 0;
          for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
            auVar87 = *pauVar37;
            auVar113 = vrcpps_avx(auVar87);
            auVar151._0_4_ = auVar112._0_4_ * auVar113._0_4_;
            auVar151._4_4_ = auVar112._4_4_ * auVar113._4_4_;
            auVar151._8_4_ = auVar112._8_4_ * auVar113._8_4_;
            auVar151._12_4_ = auVar112._12_4_ * auVar113._12_4_;
            auVar151._16_4_ = auVar112._16_4_ * auVar113._16_4_;
            auVar151._20_4_ = auVar112._20_4_ * auVar113._20_4_;
            auVar151._28_36_ = in_ZMM5._28_36_;
            auVar151._24_4_ = auVar112._24_4_ * auVar113._24_4_;
            auVar14._4_4_ = auVar87._4_4_ * auVar151._4_4_;
            auVar14._0_4_ = auVar87._0_4_ * auVar151._0_4_;
            auVar14._8_4_ = auVar87._8_4_ * auVar151._8_4_;
            auVar14._12_4_ = auVar87._12_4_ * auVar151._12_4_;
            auVar14._16_4_ = auVar87._16_4_ * auVar151._16_4_;
            auVar14._20_4_ = auVar87._20_4_ * auVar151._20_4_;
            auVar14._24_4_ = auVar87._24_4_ * auVar151._24_4_;
            auVar14._28_4_ = auVar87._28_4_;
            auVar87 = vsubps_avx(auVar112,auVar14);
            auVar122._0_4_ = auVar151._0_4_ + auVar113._0_4_ * auVar87._0_4_;
            auVar122._4_4_ = auVar151._4_4_ + auVar113._4_4_ * auVar87._4_4_;
            auVar122._8_4_ = auVar151._8_4_ + auVar113._8_4_ * auVar87._8_4_;
            auVar122._12_4_ = auVar151._12_4_ + auVar113._12_4_ * auVar87._12_4_;
            auVar122._16_4_ = auVar151._16_4_ + auVar113._16_4_ * auVar87._16_4_;
            auVar122._20_4_ = auVar151._20_4_ + auVar113._20_4_ * auVar87._20_4_;
            auVar122._24_4_ = auVar151._24_4_ + auVar113._24_4_ * auVar87._24_4_;
            auVar122._28_4_ = in_ZMM5._28_4_ + auVar87._28_4_;
            *pauVar32 = auVar122;
            pauVar37 = pauVar37 + 1;
            pauVar32 = pauVar32 + 1;
            lVar41 = lVar41 + 8;
            in_ZMM5 = ZEXT3264(auVar151._0_32_);
          }
          for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
            auVar56 = *(undefined1 (*) [16])*pauVar37;
            auVar140 = vrcpps_avx(auVar56);
            fVar131 = auVar55._0_4_ * auVar140._0_4_;
            fVar137 = auVar55._4_4_ * auVar140._4_4_;
            fVar138 = auVar55._8_4_ * auVar140._8_4_;
            fVar139 = auVar55._12_4_ * auVar140._12_4_;
            auVar72._0_4_ = auVar56._0_4_ * fVar131;
            auVar72._4_4_ = auVar56._4_4_ * fVar137;
            auVar72._8_4_ = auVar56._8_4_ * fVar138;
            auVar72._12_4_ = auVar56._12_4_ * fVar139;
            auVar56 = vsubps_avx(auVar55,auVar72);
            auVar73._0_4_ = fVar131 + auVar140._0_4_ * auVar56._0_4_;
            auVar73._4_4_ = fVar137 + auVar140._4_4_ * auVar56._4_4_;
            auVar73._8_4_ = fVar138 + auVar140._8_4_ * auVar56._8_4_;
            auVar73._12_4_ = fVar139 + auVar140._12_4_ * auVar56._12_4_;
            *(undefined1 (*) [16])*pauVar32 = auVar73;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            lVar41 = lVar41 + 4;
          }
          for (; (int)lVar41 < iVar30; lVar41 = lVar41 + 1) {
            *(float *)((long)pvVar39 + lVar41 * 4 + sVar4 * (long)local_1b8 * (long)pvVar36) =
                 fVar45 / *(float *)((long)pvVar31 + lVar41 * 4 + sVar2 * sVar3 * (long)pvVar36);
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 3) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)uVar24) {
          uVar26 = (ulong)uVar24;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_003722f8:
              auVar113._16_16_ = auVar55;
              auVar113._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_003722f8;
              auVar113 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = *pauVar37;
              auVar112 = vrcpps_avx(auVar87);
              auVar152._0_4_ = auVar113._0_4_ * auVar112._0_4_;
              auVar152._4_4_ = auVar113._4_4_ * auVar112._4_4_;
              auVar152._8_4_ = auVar113._8_4_ * auVar112._8_4_;
              auVar152._12_4_ = auVar113._12_4_ * auVar112._12_4_;
              auVar152._16_4_ = auVar113._16_4_ * auVar112._16_4_;
              auVar152._20_4_ = auVar113._20_4_ * auVar112._20_4_;
              auVar152._28_36_ = in_ZMM5._28_36_;
              auVar152._24_4_ = auVar113._24_4_ * auVar112._24_4_;
              auVar15._4_4_ = auVar87._4_4_ * auVar152._4_4_;
              auVar15._0_4_ = auVar87._0_4_ * auVar152._0_4_;
              auVar15._8_4_ = auVar87._8_4_ * auVar152._8_4_;
              auVar15._12_4_ = auVar87._12_4_ * auVar152._12_4_;
              auVar15._16_4_ = auVar87._16_4_ * auVar152._16_4_;
              auVar15._20_4_ = auVar87._20_4_ * auVar152._20_4_;
              auVar15._24_4_ = auVar87._24_4_ * auVar152._24_4_;
              auVar15._28_4_ = auVar87._28_4_;
              auVar87 = vsubps_avx(auVar113,auVar15);
              auVar123._0_4_ = auVar152._0_4_ + auVar112._0_4_ * auVar87._0_4_;
              auVar123._4_4_ = auVar152._4_4_ + auVar112._4_4_ * auVar87._4_4_;
              auVar123._8_4_ = auVar152._8_4_ + auVar112._8_4_ * auVar87._8_4_;
              auVar123._12_4_ = auVar152._12_4_ + auVar112._12_4_ * auVar87._12_4_;
              auVar123._16_4_ = auVar152._16_4_ + auVar112._16_4_ * auVar87._16_4_;
              auVar123._20_4_ = auVar152._20_4_ + auVar112._20_4_ * auVar87._20_4_;
              auVar123._24_4_ = auVar152._24_4_ + auVar112._24_4_ * auVar87._24_4_;
              auVar123._28_4_ = in_ZMM5._28_4_ + auVar87._28_4_;
              *pauVar32 = auVar123;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
              in_ZMM5 = ZEXT3264(auVar152._0_32_);
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = *(undefined1 (*) [16])*pauVar37;
              auVar140 = vrcpps_avx(auVar56);
              fVar131 = auVar55._0_4_ * auVar140._0_4_;
              fVar137 = auVar55._4_4_ * auVar140._4_4_;
              fVar138 = auVar55._8_4_ * auVar140._8_4_;
              fVar139 = auVar55._12_4_ * auVar140._12_4_;
              auVar74._0_4_ = auVar56._0_4_ * fVar131;
              auVar74._4_4_ = auVar56._4_4_ * fVar137;
              auVar74._8_4_ = auVar56._8_4_ * fVar138;
              auVar74._12_4_ = auVar56._12_4_ * fVar139;
              auVar56 = vsubps_avx(auVar55,auVar74);
              auVar75._0_4_ = fVar131 + auVar140._0_4_ * auVar56._0_4_;
              auVar75._4_4_ = fVar137 + auVar140._4_4_ * auVar56._4_4_;
              auVar75._8_4_ = fVar138 + auVar140._8_4_ * auVar56._8_4_;
              auVar75._12_4_ = fVar139 + auVar140._12_4_ * auVar56._12_4_;
              *(undefined1 (*) [16])*pauVar32 = auVar75;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 / *(float *)*pauVar37;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 2)) {
        iVar30 = iVar27 * iVar23 * uVar24;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_160) {
          uVar26 = (ulong)local_160;
        }
        pvVar31 = (void *)0x0;
        if (0 < (int)uVar29) {
          pvVar31 = (void *)local_180._0_8_;
        }
        for (; pvVar36 != pvVar31; pvVar36 = (void *)((long)pvVar36 + 1)) {
          pauVar37 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize + (long)local_1c0->data
                     );
          lVar41 = (long)local_1ac * local_168 * (long)pvVar36;
          pauVar32 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar36 * local_198->elemsize + (long)local_198->data
                     );
          for (uVar38 = 0; uVar38 != uVar26; uVar38 = uVar38 + 1) {
            fVar45 = *(float *)((long)pvVar25 + uVar38 * 4 + lVar41);
            if (iVar27 == 4) {
              auVar55 = *(undefined1 (*) [16])((long)pvVar25 + uVar38 * 0x10 + lVar41);
LAB_00372473:
              auVar114._16_16_ = auVar55;
              auVar114._0_16_ = auVar55;
            }
            else {
              auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
              if (iVar27 != 8) goto LAB_00372473;
              auVar114 = *(undefined1 (*) [32])((long)pvVar25 + uVar38 * 0x20 + lVar41);
            }
            for (iVar28 = 0; iVar28 + 7 < iVar30; iVar28 = iVar28 + 8) {
              auVar87 = *pauVar37;
              auVar112 = vrcpps_avx(auVar87);
              auVar153._0_4_ = auVar114._0_4_ * auVar112._0_4_;
              auVar153._4_4_ = auVar114._4_4_ * auVar112._4_4_;
              auVar153._8_4_ = auVar114._8_4_ * auVar112._8_4_;
              auVar153._12_4_ = auVar114._12_4_ * auVar112._12_4_;
              auVar153._16_4_ = auVar114._16_4_ * auVar112._16_4_;
              auVar153._20_4_ = auVar114._20_4_ * auVar112._20_4_;
              auVar153._28_36_ = in_ZMM5._28_36_;
              auVar153._24_4_ = auVar114._24_4_ * auVar112._24_4_;
              auVar16._4_4_ = auVar87._4_4_ * auVar153._4_4_;
              auVar16._0_4_ = auVar87._0_4_ * auVar153._0_4_;
              auVar16._8_4_ = auVar87._8_4_ * auVar153._8_4_;
              auVar16._12_4_ = auVar87._12_4_ * auVar153._12_4_;
              auVar16._16_4_ = auVar87._16_4_ * auVar153._16_4_;
              auVar16._20_4_ = auVar87._20_4_ * auVar153._20_4_;
              auVar16._24_4_ = auVar87._24_4_ * auVar153._24_4_;
              auVar16._28_4_ = auVar87._28_4_;
              auVar87 = vsubps_avx(auVar114,auVar16);
              auVar124._0_4_ = auVar153._0_4_ + auVar112._0_4_ * auVar87._0_4_;
              auVar124._4_4_ = auVar153._4_4_ + auVar112._4_4_ * auVar87._4_4_;
              auVar124._8_4_ = auVar153._8_4_ + auVar112._8_4_ * auVar87._8_4_;
              auVar124._12_4_ = auVar153._12_4_ + auVar112._12_4_ * auVar87._12_4_;
              auVar124._16_4_ = auVar153._16_4_ + auVar112._16_4_ * auVar87._16_4_;
              auVar124._20_4_ = auVar153._20_4_ + auVar112._20_4_ * auVar87._20_4_;
              auVar124._24_4_ = auVar153._24_4_ + auVar112._24_4_ * auVar87._24_4_;
              auVar124._28_4_ = in_ZMM5._28_4_ + auVar87._28_4_;
              *pauVar32 = auVar124;
              pauVar37 = pauVar37 + 1;
              pauVar32 = pauVar32 + 1;
              in_ZMM5 = ZEXT3264(auVar153._0_32_);
            }
            for (; iVar28 + 3 < iVar30; iVar28 = iVar28 + 4) {
              auVar56 = *(undefined1 (*) [16])*pauVar37;
              auVar140 = vrcpps_avx(auVar56);
              fVar131 = auVar55._0_4_ * auVar140._0_4_;
              fVar137 = auVar55._4_4_ * auVar140._4_4_;
              fVar138 = auVar55._8_4_ * auVar140._8_4_;
              fVar139 = auVar55._12_4_ * auVar140._12_4_;
              auVar76._0_4_ = auVar56._0_4_ * fVar131;
              auVar76._4_4_ = auVar56._4_4_ * fVar137;
              auVar76._8_4_ = auVar56._8_4_ * fVar138;
              auVar76._12_4_ = auVar56._12_4_ * fVar139;
              auVar56 = vsubps_avx(auVar55,auVar76);
              auVar77._0_4_ = fVar131 + auVar140._0_4_ * auVar56._0_4_;
              auVar77._4_4_ = fVar137 + auVar140._4_4_ * auVar56._4_4_;
              auVar77._8_4_ = fVar138 + auVar140._8_4_ * auVar56._8_4_;
              auVar77._12_4_ = fVar139 + auVar140._12_4_ * auVar56._12_4_;
              *(undefined1 (*) [16])*pauVar32 = auVar77;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
            }
            for (; iVar28 < iVar30; iVar28 = iVar28 + 1) {
              *(float *)*pauVar32 = fVar45 / *(float *)*pauVar37;
              pauVar37 = (undefined1 (*) [32])(*pauVar37 + 4);
              pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 4);
            }
          }
        }
        iVar30 = local_1c0->dims;
      }
      if ((iVar30 == 4) && (iVar43 == 3)) {
        iVar23 = iVar23 * iVar27;
        pvVar31 = (void *)0x0;
        pvVar36 = (void *)(ulong)uVar24;
        if ((int)uVar24 < 1) {
          pvVar36 = pvVar31;
        }
        pvVar39 = (void *)(ulong)local_160;
        if ((int)local_160 < 1) {
          pvVar39 = pvVar31;
        }
        if ((int)uVar29 < 1) {
          local_180._0_8_ = pvVar31;
        }
        local_148 = local_148 * local_168;
        for (; pvVar31 != (void *)local_180._0_8_; pvVar31 = (void *)((long)pvVar31 + 1)) {
          pauVar32 = (undefined1 (*) [32])
                     (local_1c0->cstep * (long)pvVar31 * local_1c0->elemsize + (long)local_1c0->data
                     );
          pauVar37 = (undefined1 (*) [32])
                     (local_198->cstep * (long)pvVar31 * local_198->elemsize + (long)local_198->data
                     );
          for (pvVar42 = (void *)0x0; pvVar42 != pvVar39; pvVar42 = (void *)((long)pvVar42 + 1)) {
            lVar41 = (long)local_1ac * local_168 * (long)pvVar42 + local_148 * (long)pvVar31;
            for (pvVar34 = (void *)0x0; pvVar34 != pvVar36; pvVar34 = (void *)((long)pvVar34 + 1)) {
              fVar45 = *(float *)((long)pvVar25 + (long)pvVar34 * 4 + lVar41);
              if (iVar27 == 4) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar25 + (long)pvVar34 * 0x10 + lVar41);
LAB_00372619:
                auVar115._16_16_ = auVar55;
                auVar115._0_16_ = auVar55;
              }
              else {
                auVar55 = vshufps_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),0);
                if (iVar27 != 8) goto LAB_00372619;
                auVar115 = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar34 * 0x20 + lVar41);
              }
              for (iVar43 = 0; iVar43 + 7 < iVar23; iVar43 = iVar43 + 8) {
                auVar87 = *pauVar32;
                auVar112 = vrcpps_avx(auVar87);
                auVar154._0_4_ = auVar115._0_4_ * auVar112._0_4_;
                auVar154._4_4_ = auVar115._4_4_ * auVar112._4_4_;
                auVar154._8_4_ = auVar115._8_4_ * auVar112._8_4_;
                auVar154._12_4_ = auVar115._12_4_ * auVar112._12_4_;
                auVar154._16_4_ = auVar115._16_4_ * auVar112._16_4_;
                auVar154._20_4_ = auVar115._20_4_ * auVar112._20_4_;
                auVar154._28_36_ = in_ZMM5._28_36_;
                auVar154._24_4_ = auVar115._24_4_ * auVar112._24_4_;
                auVar17._4_4_ = auVar87._4_4_ * auVar154._4_4_;
                auVar17._0_4_ = auVar87._0_4_ * auVar154._0_4_;
                auVar17._8_4_ = auVar87._8_4_ * auVar154._8_4_;
                auVar17._12_4_ = auVar87._12_4_ * auVar154._12_4_;
                auVar17._16_4_ = auVar87._16_4_ * auVar154._16_4_;
                auVar17._20_4_ = auVar87._20_4_ * auVar154._20_4_;
                auVar17._24_4_ = auVar87._24_4_ * auVar154._24_4_;
                auVar17._28_4_ = auVar87._28_4_;
                auVar87 = vsubps_avx(auVar115,auVar17);
                auVar125._0_4_ = auVar154._0_4_ + auVar112._0_4_ * auVar87._0_4_;
                auVar125._4_4_ = auVar154._4_4_ + auVar112._4_4_ * auVar87._4_4_;
                auVar125._8_4_ = auVar154._8_4_ + auVar112._8_4_ * auVar87._8_4_;
                auVar125._12_4_ = auVar154._12_4_ + auVar112._12_4_ * auVar87._12_4_;
                auVar125._16_4_ = auVar154._16_4_ + auVar112._16_4_ * auVar87._16_4_;
                auVar125._20_4_ = auVar154._20_4_ + auVar112._20_4_ * auVar87._20_4_;
                auVar125._24_4_ = auVar154._24_4_ + auVar112._24_4_ * auVar87._24_4_;
                auVar125._28_4_ = in_ZMM5._28_4_ + auVar87._28_4_;
                *pauVar37 = auVar125;
                pauVar32 = pauVar32 + 1;
                pauVar37 = pauVar37 + 1;
                in_ZMM5 = ZEXT3264(auVar154._0_32_);
              }
              for (; iVar43 + 3 < iVar23; iVar43 = iVar43 + 4) {
                auVar56 = *(undefined1 (*) [16])*pauVar32;
                auVar140 = vrcpps_avx(auVar56);
                fVar131 = auVar55._0_4_ * auVar140._0_4_;
                fVar137 = auVar55._4_4_ * auVar140._4_4_;
                fVar138 = auVar55._8_4_ * auVar140._8_4_;
                fVar139 = auVar55._12_4_ * auVar140._12_4_;
                auVar78._0_4_ = auVar56._0_4_ * fVar131;
                auVar78._4_4_ = auVar56._4_4_ * fVar137;
                auVar78._8_4_ = auVar56._8_4_ * fVar138;
                auVar78._12_4_ = auVar56._12_4_ * fVar139;
                auVar56 = vsubps_avx(auVar55,auVar78);
                auVar79._0_4_ = fVar131 + auVar140._0_4_ * auVar56._0_4_;
                auVar79._4_4_ = fVar137 + auVar140._4_4_ * auVar56._4_4_;
                auVar79._8_4_ = fVar138 + auVar140._8_4_ * auVar56._8_4_;
                auVar79._12_4_ = fVar139 + auVar140._12_4_ * auVar56._12_4_;
                *(undefined1 (*) [16])*pauVar37 = auVar79;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
                pauVar37 = (undefined1 (*) [32])((long)*pauVar37 + 0x10);
              }
              for (; iVar43 < iVar23; iVar43 = iVar43 + 1) {
                *(float *)*pauVar37 = fVar45 / *(float *)*pauVar32;
                pauVar32 = (undefined1 (*) [32])(*pauVar32 + 4);
                pauVar37 = (undefined1 (*) [32])((long)*pauVar37 + 4);
              }
            }
          }
        }
      }
      break;
    case 9:
      local_160 = local_1c0->w;
      local_1a0 = (void *)(ulong)(uint)local_1c0->h;
      local_e8 = (void *)(ulong)(uint)local_1c0->d;
      local_f0 = (void *)(ulong)(uint)local_1c0->c;
      iVar23 = local_1c0->elempack;
      iVar27 = local_1c0->dims;
      local_104 = iVar23;
      if ((iVar27 == 2) && (iVar43 == 1)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < local_1c0->h) {
          local_b0 = local_1a0;
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_130 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036e993:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_0036e993;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)(long)local_1c0->w;
          local_1b8 = local_1c0->data;
          local_110 = (void *)local_1c0->elemsize;
          pfVar33 = (float *)((long)pvVar36 * (long)local_140 * (long)local_110 + (long)local_1b8);
          local_118 = (size_t)local_198->w;
          local_a8 = local_198->elemsize;
          local_180._0_8_ = local_198->data;
          pfVar35 = (float *)((long)pvVar36 * local_118 * local_a8 + (long)local_198->data);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                      ((binary_op_rpow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                 ((binary_op_rpow *)&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_180._0_8_ = local_180._0_8_ + local_a8 * (long)local_138 * local_118;
          local_1b8 = (void *)((long)local_1b8 + (long)local_110 * (long)local_138 * (long)local_140
                              );
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = powf((float)local_130._0_4_,*(float *)((long)local_1b8 + lVar41 * 4));
            *(float *)(local_180._0_8_ + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 - 3U < 2) && ((int)local_1a8 == 1)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0 * (int)local_e8;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_b0 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_130 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_003729bc:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_003729bc;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)local_1c0->cstep;
          local_1b8 = local_1c0->data;
          local_110 = (void *)local_1c0->elemsize;
          pfVar33 = (float *)((long)local_140 * (long)pvVar36 * (long)local_110 + (long)local_1b8);
          local_118 = local_198->cstep;
          local_a8 = local_198->elemsize;
          local_180._0_8_ = local_198->data;
          pfVar35 = (float *)(local_118 * (long)pvVar36 * local_a8 + (long)local_198->data);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                      ((binary_op_rpow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                 ((binary_op_rpow *)&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_180._0_8_ = local_180._0_8_ + local_118 * local_a8 * (long)local_138;
          local_1b8 = (void *)((long)local_1b8 + (long)local_140 * (long)local_110 * (long)local_138
                              );
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = powf((float)local_130._0_4_,*(float *)((long)local_1b8 + lVar41 * 4));
            *(float *)(local_180._0_8_ + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 3) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_1a0) {
          uVar26 = (ulong)local_1a0 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            local_130 = ZEXT416(*(uint *)((long)local_138 + (long)pvVar25 * 4));
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_00373333:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vpshufd_avx(local_130,0);
              if (iVar23 != 8) goto LAB_00373333;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                        ((binary_op_rpow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                   ((binary_op_rpow *)&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = powf((float)local_130._0_4_,*pfVar35);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_e8) {
          uVar26 = (ulong)local_e8 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            local_130 = ZEXT416(*(uint *)((long)local_138 + (long)pvVar25 * 4));
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_00373ba9:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vpshufd_avx(local_130,0);
              if (iVar23 != 8) goto LAB_00373ba9;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                        ((binary_op_rpow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                   ((binary_op_rpow *)&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = powf((float)local_130._0_4_,*pfVar35);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 3)) {
        local_160 = local_160 * iVar23;
        pvVar25 = (void *)0x0;
        iVar43 = (int)local_1a0;
        local_1a0 = (void *)((ulong)local_1a0 & 0xffffffff);
        if (iVar43 < 1) {
          local_1a0 = pvVar25;
        }
        iVar43 = (int)local_e8;
        local_e8 = (void *)((ulong)local_e8 & 0xffffffff);
        if (iVar43 < 1) {
          local_e8 = pvVar25;
        }
        iVar43 = (int)local_f0;
        local_f0 = (void *)((ulong)local_f0 & 0xffffffff);
        if (iVar43 < 1) {
          local_f0 = pvVar25;
        }
        local_148 = local_148 * local_168;
        local_168 = (long)local_1ac * local_168;
        while (pvVar25 != local_f0) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar25 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pfVar35 = (float *)(local_198->cstep * (long)pvVar25 * local_198->elemsize +
                             (long)local_198->data);
          local_1a8 = (void *)(local_148 * (long)pvVar25 + (long)local_1c8);
          pvVar36 = (void *)0x0;
          local_140 = pvVar25;
          while (pvVar36 != local_e8) {
            local_180._0_8_ = (void *)(local_168 * (long)pvVar36 + (long)local_1a8);
            pvVar25 = (void *)0x0;
            local_138 = pvVar36;
            while (pvVar25 != local_1a0) {
              local_130 = ZEXT416(*(uint *)(local_180._0_8_ + (long)pvVar25 * 4));
              if (iVar23 == 4) {
                local_100 = *(__m128 *)(local_180._0_8_ + (long)pvVar25 * 0x10);
LAB_003744fa:
                local_a0.elemsize._0_4_ = local_100[0];
                local_a0.elemsize._4_4_ = local_100[1];
                local_a0.elempack = local_100[2];
                local_a0._28_4_ = local_100[3];
                local_a0.data._0_4_ = local_100[0];
                local_a0.data._4_4_ = local_100[1];
                local_a0.refcount._0_4_ = local_100[2];
                local_a0.refcount._4_4_ = local_100[3];
              }
              else {
                local_100 = (__m128)vpshufd_avx(local_130,0);
                if (iVar23 != 8) goto LAB_003744fa;
                local_a0._0_32_ = *(undefined1 (*) [32])(local_180._0_8_ + (long)pvVar25 * 0x20);
              }
              local_1b8 = pvVar25;
              for (iVar43 = 0; iVar43 + 7 < (int)local_160; iVar43 = iVar43 + 8) {
                uVar52 = *(undefined8 *)pfVar33;
                uVar51 = *(undefined8 *)(pfVar33 + 2);
                uVar53 = *(undefined8 *)(pfVar33 + 4);
                uVar54 = *(undefined8 *)(pfVar33 + 6);
                local_e0 = (float  [2])uVar52;
                afStack_d8 = (float  [2])uVar51;
                afStack_d0 = (float  [2])uVar53;
                afStack_c8._0_8_ = uVar54;
                BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                          ((binary_op_rpow *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
                *(undefined8 *)pfVar35 = uVar52;
                *(undefined8 *)(pfVar35 + 2) = uVar51;
                *(undefined8 *)(pfVar35 + 4) = uVar53;
                *(undefined8 *)(pfVar35 + 6) = uVar54;
                pfVar33 = pfVar33 + 8;
                pfVar35 = pfVar35 + 8;
              }
              for (; iVar43 + 3 < (int)local_160; iVar43 = iVar43 + 4) {
                local_e0 = *(float (*) [2])pfVar33;
                uVar52 = *(undefined8 *)(pfVar33 + 2);
                afStack_d8 = (float  [2])uVar52;
                afVar155 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                     ((binary_op_rpow *)&local_1c9,(__m128 *)local_e0,&local_100);
                *(long *)pfVar35 = afVar155._0_8_;
                *(undefined8 *)(pfVar35 + 2) = uVar52;
                pfVar33 = pfVar33 + 4;
                pfVar35 = pfVar35 + 4;
              }
              for (; iVar43 < (int)local_160; iVar43 = iVar43 + 1) {
                fVar45 = powf((float)local_130._0_4_,*pfVar33);
                *pfVar35 = fVar45;
                pfVar33 = pfVar33 + 1;
                pfVar35 = pfVar35 + 1;
              }
              iVar23 = local_104;
              pvVar25 = (void *)((long)local_1b8 + 1);
            }
            pvVar36 = (void *)((long)local_138 + 1);
          }
          pvVar25 = (void *)((long)local_140 + 1);
        }
      }
      break;
    case 10:
      local_160 = local_1c0->w;
      local_1a0 = (void *)(ulong)(uint)local_1c0->h;
      local_e8 = (void *)(ulong)(uint)local_1c0->d;
      local_f0 = (void *)(ulong)(uint)local_1c0->c;
      iVar23 = local_1c0->elempack;
      iVar27 = local_1c0->dims;
      local_104 = iVar23;
      if ((iVar27 == 2) && (iVar43 == 1)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < local_1c0->h) {
          local_b0 = local_1a0;
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_180 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036f7bb:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_180,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_0036f7bb;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)(long)local_1c0->w;
          local_110 = (void *)local_1c0->elemsize;
          local_130._0_8_ = local_1c0->data;
          pfVar33 = (float *)((long)pvVar36 * (long)local_140 * (long)local_110 +
                             (long)local_1c0->data);
          local_118 = (size_t)local_198->w;
          local_1b8 = local_198->data;
          local_a8 = local_198->elemsize;
          pfVar35 = (float *)((long)pvVar36 * local_118 * local_a8 + (long)local_1b8);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                      ((binary_op_atan2 *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                 ((binary_op_atan2 *)&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_1b8 = (void *)((long)local_1b8 + local_a8 * (long)local_138 * local_118);
          local_130._0_8_ = local_130._0_8_ + (long)local_110 * (long)local_138 * (long)local_140;
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = atan2f(*(float *)(local_130._0_8_ + lVar41 * 4),local_180._0_4_);
            *(float *)((long)local_1b8 + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 - 3U < 2) && ((int)local_1a8 == 1)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0 * (int)local_e8;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_b0 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_180 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_00372e54:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_180,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_00372e54;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)local_1c0->cstep;
          local_110 = (void *)local_1c0->elemsize;
          local_130._0_8_ = local_1c0->data;
          pfVar33 = (float *)((long)local_140 * (long)pvVar36 * (long)local_110 +
                             (long)local_1c0->data);
          local_118 = local_198->cstep;
          local_1b8 = local_198->data;
          local_a8 = local_198->elemsize;
          pfVar35 = (float *)(local_118 * (long)pvVar36 * local_a8 + (long)local_1b8);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                      ((binary_op_atan2 *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                 ((binary_op_atan2 *)&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_1b8 = (void *)((long)local_1b8 + local_118 * local_a8 * (long)local_138);
          local_130._0_8_ = local_130._0_8_ + (long)local_140 * (long)local_110 * (long)local_138;
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = atan2f(*(float *)(local_130._0_8_ + lVar41 * 4),local_180._0_4_);
            *(float *)((long)local_1b8 + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 3) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_1a0) {
          uVar26 = (ulong)local_1a0 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            uVar24 = *(uint *)((long)local_138 + (long)pvVar25 * 4);
            local_130 = ZEXT416(uVar24);
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_00373765:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
              if (iVar23 != 8) goto LAB_00373765;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                   ((binary_op_atan2 *)&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = atan2f(*pfVar35,local_130._0_4_);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_e8) {
          uVar26 = (ulong)local_e8 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            uVar24 = *(uint *)((long)local_138 + (long)pvVar25 * 4);
            local_130 = ZEXT416(uVar24);
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_00373fed:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
              if (iVar23 != 8) goto LAB_00373fed;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                   ((binary_op_atan2 *)&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = atan2f(*pfVar35,local_130._0_4_);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 3)) {
        local_160 = local_160 * iVar23;
        pvVar25 = (void *)0x0;
        iVar43 = (int)local_1a0;
        local_1a0 = (void *)((ulong)local_1a0 & 0xffffffff);
        if (iVar43 < 1) {
          local_1a0 = pvVar25;
        }
        iVar43 = (int)local_e8;
        local_e8 = (void *)((ulong)local_e8 & 0xffffffff);
        if (iVar43 < 1) {
          local_e8 = pvVar25;
        }
        iVar43 = (int)local_f0;
        local_f0 = (void *)((ulong)local_f0 & 0xffffffff);
        if (iVar43 < 1) {
          local_f0 = pvVar25;
        }
        local_148 = local_148 * local_168;
        local_168 = (long)local_1ac * local_168;
        while (pvVar25 != local_f0) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar25 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pfVar35 = (float *)(local_198->cstep * (long)pvVar25 * local_198->elemsize +
                             (long)local_198->data);
          local_1a8 = (void *)(local_148 * (long)pvVar25 + (long)local_1c8);
          pvVar36 = (void *)0x0;
          local_140 = pvVar25;
          while (pvVar36 != local_e8) {
            local_180._0_8_ = (void *)(local_168 * (long)pvVar36 + (long)local_1a8);
            pvVar25 = (void *)0x0;
            local_138 = pvVar36;
            while (pvVar25 != local_1a0) {
              uVar24 = *(uint *)(local_180._0_8_ + (long)pvVar25 * 4);
              local_130 = ZEXT416(uVar24);
              if (iVar23 == 4) {
                local_100 = *(__m128 *)(local_180._0_8_ + (long)pvVar25 * 0x10);
LAB_00374a10:
                local_a0.elemsize._0_4_ = local_100[0];
                local_a0.elemsize._4_4_ = local_100[1];
                local_a0.elempack = local_100[2];
                local_a0._28_4_ = local_100[3];
                local_a0.data._0_4_ = local_100[0];
                local_a0.data._4_4_ = local_100[1];
                local_a0.refcount._0_4_ = local_100[2];
                local_a0.refcount._4_4_ = local_100[3];
              }
              else {
                local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
                if (iVar23 != 8) goto LAB_00374a10;
                local_a0._0_32_ = *(undefined1 (*) [32])(local_180._0_8_ + (long)pvVar25 * 0x20);
              }
              local_1b8 = pvVar25;
              for (iVar43 = 0; iVar43 + 7 < (int)local_160; iVar43 = iVar43 + 8) {
                uVar52 = *(undefined8 *)pfVar33;
                uVar51 = *(undefined8 *)(pfVar33 + 2);
                uVar53 = *(undefined8 *)(pfVar33 + 4);
                uVar54 = *(undefined8 *)(pfVar33 + 6);
                local_e0 = (float  [2])uVar52;
                afStack_d8 = (float  [2])uVar51;
                afStack_d0 = (float  [2])uVar53;
                afStack_c8._0_8_ = uVar54;
                BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                          ((binary_op_atan2 *)&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
                *(undefined8 *)pfVar35 = uVar52;
                *(undefined8 *)(pfVar35 + 2) = uVar51;
                *(undefined8 *)(pfVar35 + 4) = uVar53;
                *(undefined8 *)(pfVar35 + 6) = uVar54;
                pfVar33 = pfVar33 + 8;
                pfVar35 = pfVar35 + 8;
              }
              for (; iVar43 + 3 < (int)local_160; iVar43 = iVar43 + 4) {
                local_e0 = *(float (*) [2])pfVar33;
                uVar52 = *(undefined8 *)(pfVar33 + 2);
                afStack_d8 = (float  [2])uVar52;
                afVar155 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                     ((binary_op_atan2 *)&local_1c9,(__m128 *)local_e0,&local_100);
                *(long *)pfVar35 = afVar155._0_8_;
                *(undefined8 *)(pfVar35 + 2) = uVar52;
                pfVar33 = pfVar33 + 4;
                pfVar35 = pfVar35 + 4;
              }
              for (; iVar43 < (int)local_160; iVar43 = iVar43 + 1) {
                fVar45 = atan2f(*pfVar33,local_130._0_4_);
                *pfVar35 = fVar45;
                pfVar33 = pfVar33 + 1;
                pfVar35 = pfVar35 + 1;
              }
              iVar23 = local_104;
              pvVar25 = (void *)((long)local_1b8 + 1);
            }
            pvVar36 = (void *)((long)local_138 + 1);
          }
          pvVar25 = (void *)((long)local_140 + 1);
        }
      }
      break;
    case 0xb:
      local_160 = local_1c0->w;
      local_1a0 = (void *)(ulong)(uint)local_1c0->h;
      local_e8 = (void *)(ulong)(uint)local_1c0->d;
      local_f0 = (void *)(ulong)(uint)local_1c0->c;
      iVar23 = local_1c0->elempack;
      iVar27 = local_1c0->dims;
      local_104 = iVar23;
      if ((iVar27 == 2) && (iVar43 == 1)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < local_1c0->h) {
          local_b0 = local_1a0;
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_130 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_0036e5af:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_0036e5af;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)(long)local_1c0->w;
          local_1b8 = local_1c0->data;
          local_110 = (void *)local_1c0->elemsize;
          pfVar33 = (float *)((long)pvVar36 * (long)local_140 * (long)local_110 + (long)local_1b8);
          local_118 = (size_t)local_198->w;
          local_a8 = local_198->elemsize;
          local_180._0_8_ = local_198->data;
          pfVar35 = (float *)((long)pvVar36 * local_118 * local_a8 + (long)local_198->data);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                      (&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                 (&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_180._0_8_ = local_180._0_8_ + local_a8 * (long)local_138 * local_118;
          local_1b8 = (void *)((long)local_1b8 + (long)local_110 * (long)local_138 * (long)local_140
                              );
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = atan2f((float)local_130._0_4_,*(float *)((long)local_1b8 + lVar41 * 4));
            *(float *)(local_180._0_8_ + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 - 3U < 2) && ((int)local_1a8 == 1)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0 * (int)local_e8;
        pvVar36 = (void *)0x0;
        local_b0 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_b0 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        for (; pvVar36 != local_b0; pvVar36 = (void *)((long)pvVar36 + 1)) {
          uVar24 = *(uint *)((long)pvVar25 + (long)pvVar36 * 4);
          local_130 = ZEXT416(uVar24);
          if (iVar23 == 4) {
            local_100 = *(__m128 *)((long)pvVar25 + (long)pvVar36 * 0x10);
LAB_00372770:
            local_a0.elemsize._0_4_ = local_100[0];
            local_a0.elemsize._4_4_ = local_100[1];
            local_a0.elempack = local_100[2];
            local_a0._28_4_ = local_100[3];
            local_a0.data._0_4_ = local_100[0];
            local_a0.data._4_4_ = local_100[1];
            local_a0.refcount._0_4_ = local_100[2];
            local_a0.refcount._4_4_ = local_100[3];
          }
          else {
            local_100 = (__m128)vshufps_avx(local_130,ZEXT416(uVar24),0);
            if (iVar23 != 8) goto LAB_00372770;
            local_a0._0_32_ = *(undefined1 (*) [32])((long)pvVar25 + (long)pvVar36 * 0x20);
          }
          local_140 = (void *)local_1c0->cstep;
          local_1b8 = local_1c0->data;
          local_110 = (void *)local_1c0->elemsize;
          pfVar33 = (float *)((long)local_140 * (long)pvVar36 * (long)local_110 + (long)local_1b8);
          local_118 = local_198->cstep;
          local_a8 = local_198->elemsize;
          local_180._0_8_ = local_198->data;
          pfVar35 = (float *)(local_118 * (long)pvVar36 * local_a8 + (long)local_198->data);
          lVar41 = 0;
          local_138 = pvVar36;
          for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
            uVar52 = *(undefined8 *)pfVar33;
            uVar51 = *(undefined8 *)(pfVar33 + 2);
            uVar53 = *(undefined8 *)(pfVar33 + 4);
            uVar54 = *(undefined8 *)(pfVar33 + 6);
            local_e0 = (float  [2])uVar52;
            afStack_d8 = (float  [2])uVar51;
            afStack_d0 = (float  [2])uVar53;
            afStack_c8._0_8_ = uVar54;
            BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                      (&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
            *(undefined8 *)pfVar35 = uVar52;
            *(undefined8 *)(pfVar35 + 2) = uVar51;
            *(undefined8 *)(pfVar35 + 4) = uVar53;
            *(undefined8 *)(pfVar35 + 6) = uVar54;
            pfVar33 = pfVar33 + 8;
            pfVar35 = pfVar35 + 8;
            lVar41 = lVar41 + 8;
          }
          for (; iVar23 = local_104, pvVar36 = local_138, pvVar25 = local_1c8, iVar27 + 3 < iVar43;
              iVar27 = iVar27 + 4) {
            local_e0 = *(float (*) [2])pfVar33;
            uVar52 = *(undefined8 *)(pfVar33 + 2);
            afStack_d8 = (float  [2])uVar52;
            afVar155 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                 (&local_1c9,(__m128 *)local_e0,&local_100);
            *(long *)pfVar35 = afVar155._0_8_;
            *(undefined8 *)(pfVar35 + 2) = uVar52;
            pfVar33 = pfVar33 + 4;
            pfVar35 = pfVar35 + 4;
            lVar41 = lVar41 + 4;
          }
          local_180._0_8_ = local_180._0_8_ + local_118 * local_a8 * (long)local_138;
          local_1b8 = (void *)((long)local_1b8 + (long)local_140 * (long)local_110 * (long)local_138
                              );
          for (; (int)lVar41 < iVar43; lVar41 = lVar41 + 1) {
            fVar45 = atan2f((float)local_130._0_4_,*(float *)((long)local_1b8 + lVar41 * 4));
            *(float *)(local_180._0_8_ + lVar41 * 4) = fVar45;
          }
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 3) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_1a0) {
          uVar26 = (ulong)local_1a0 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            local_130 = ZEXT416(*(uint *)((long)local_138 + (long)pvVar25 * 4));
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_0037311a:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vpshufd_avx(local_130,0);
              if (iVar23 != 8) goto LAB_0037311a;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                        (&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                   (&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = atan2f((float)local_130._0_4_,*pfVar35);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 2)) {
        iVar43 = iVar23 * local_160 * (int)local_1a0;
        pvVar36 = (void *)0x0;
        uVar26 = 0;
        if (0 < (int)local_e8) {
          uVar26 = (ulong)local_e8 & 0xffffffff;
        }
        local_180._0_8_ = uVar26;
        local_110 = (void *)0x0;
        if (0 < (int)local_f0) {
          local_110 = (void *)((ulong)local_f0 & 0xffffffff);
        }
        local_118 = (long)local_1ac * local_168;
        while (pvVar36 != local_110) {
          pfVar35 = (float *)(local_1c0->cstep * (long)pvVar36 * local_1c0->elemsize +
                             (long)local_1c0->data);
          local_138 = (void *)(local_118 * (long)pvVar36 + (long)pvVar25);
          pfVar33 = (float *)(local_198->cstep * (long)pvVar36 * local_198->elemsize +
                             (long)local_198->data);
          pvVar25 = (void *)0x0;
          local_140 = pvVar36;
          while (pvVar25 != (void *)local_180._0_8_) {
            local_130 = ZEXT416(*(uint *)((long)local_138 + (long)pvVar25 * 4));
            if (iVar23 == 4) {
              local_100 = *(__m128 *)((long)local_138 + (long)pvVar25 * 0x10);
LAB_00373987:
              local_a0.elemsize._0_4_ = local_100[0];
              local_a0.elemsize._4_4_ = local_100[1];
              local_a0.elempack = local_100[2];
              local_a0._28_4_ = local_100[3];
              local_a0.data._0_4_ = local_100[0];
              local_a0.data._4_4_ = local_100[1];
              local_a0.refcount._0_4_ = local_100[2];
              local_a0.refcount._4_4_ = local_100[3];
            }
            else {
              local_100 = (__m128)vpshufd_avx(local_130,0);
              if (iVar23 != 8) goto LAB_00373987;
              local_a0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)pvVar25 * 0x20);
            }
            local_1b8 = pvVar25;
            for (iVar27 = 0; iVar27 + 7 < iVar43; iVar27 = iVar27 + 8) {
              uVar52 = *(undefined8 *)pfVar35;
              uVar51 = *(undefined8 *)(pfVar35 + 2);
              uVar53 = *(undefined8 *)(pfVar35 + 4);
              uVar54 = *(undefined8 *)(pfVar35 + 6);
              local_e0 = (float  [2])uVar52;
              afStack_d8 = (float  [2])uVar51;
              afStack_d0 = (float  [2])uVar53;
              afStack_c8._0_8_ = uVar54;
              BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                        (&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
              *(undefined8 *)pfVar33 = uVar52;
              *(undefined8 *)(pfVar33 + 2) = uVar51;
              *(undefined8 *)(pfVar33 + 4) = uVar53;
              *(undefined8 *)(pfVar33 + 6) = uVar54;
              pfVar35 = pfVar35 + 8;
              pfVar33 = pfVar33 + 8;
            }
            for (; iVar27 + 3 < iVar43; iVar27 = iVar27 + 4) {
              local_e0 = *(float (*) [2])pfVar35;
              uVar52 = *(undefined8 *)(pfVar35 + 2);
              afStack_d8 = (float  [2])uVar52;
              afVar155 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                   (&local_1c9,(__m128 *)local_e0,&local_100);
              *(long *)pfVar33 = afVar155._0_8_;
              *(undefined8 *)(pfVar33 + 2) = uVar52;
              pfVar35 = pfVar35 + 4;
              pfVar33 = pfVar33 + 4;
            }
            for (; iVar27 < iVar43; iVar27 = iVar27 + 1) {
              fVar45 = atan2f((float)local_130._0_4_,*pfVar35);
              *pfVar33 = fVar45;
              pfVar35 = pfVar35 + 1;
              pfVar33 = pfVar33 + 1;
            }
            pvVar25 = (void *)((long)local_1b8 + 1);
          }
          pvVar25 = local_1c8;
          pvVar36 = (void *)((long)local_140 + 1);
        }
        iVar27 = local_1c0->dims;
      }
      if ((iVar27 == 4) && ((int)local_1a8 == 3)) {
        local_160 = local_160 * iVar23;
        pvVar25 = (void *)0x0;
        iVar43 = (int)local_1a0;
        local_1a0 = (void *)((ulong)local_1a0 & 0xffffffff);
        if (iVar43 < 1) {
          local_1a0 = pvVar25;
        }
        iVar43 = (int)local_e8;
        local_e8 = (void *)((ulong)local_e8 & 0xffffffff);
        if (iVar43 < 1) {
          local_e8 = pvVar25;
        }
        iVar43 = (int)local_f0;
        local_f0 = (void *)((ulong)local_f0 & 0xffffffff);
        if (iVar43 < 1) {
          local_f0 = pvVar25;
        }
        local_148 = local_148 * local_168;
        local_168 = (long)local_1ac * local_168;
        while (pvVar25 != local_f0) {
          pfVar33 = (float *)(local_1c0->cstep * (long)pvVar25 * local_1c0->elemsize +
                             (long)local_1c0->data);
          pfVar35 = (float *)(local_198->cstep * (long)pvVar25 * local_198->elemsize +
                             (long)local_198->data);
          local_1a8 = (void *)(local_148 * (long)pvVar25 + (long)local_1c8);
          pvVar36 = (void *)0x0;
          local_140 = pvVar25;
          while (pvVar36 != local_e8) {
            local_180._0_8_ = (void *)(local_168 * (long)pvVar36 + (long)local_1a8);
            pvVar25 = (void *)0x0;
            local_138 = pvVar36;
            while (pvVar25 != local_1a0) {
              local_130 = ZEXT416(*(uint *)(local_180._0_8_ + (long)pvVar25 * 4));
              if (iVar23 == 4) {
                local_100 = *(__m128 *)(local_180._0_8_ + (long)pvVar25 * 0x10);
LAB_0037426f:
                local_a0.elemsize._0_4_ = local_100[0];
                local_a0.elemsize._4_4_ = local_100[1];
                local_a0.elempack = local_100[2];
                local_a0._28_4_ = local_100[3];
                local_a0.data._0_4_ = local_100[0];
                local_a0.data._4_4_ = local_100[1];
                local_a0.refcount._0_4_ = local_100[2];
                local_a0.refcount._4_4_ = local_100[3];
              }
              else {
                local_100 = (__m128)vpshufd_avx(local_130,0);
                if (iVar23 != 8) goto LAB_0037426f;
                local_a0._0_32_ = *(undefined1 (*) [32])(local_180._0_8_ + (long)pvVar25 * 0x20);
              }
              local_1b8 = pvVar25;
              for (iVar43 = 0; iVar43 + 7 < (int)local_160; iVar43 = iVar43 + 8) {
                uVar52 = *(undefined8 *)pfVar33;
                uVar51 = *(undefined8 *)(pfVar33 + 2);
                uVar53 = *(undefined8 *)(pfVar33 + 4);
                uVar54 = *(undefined8 *)(pfVar33 + 6);
                local_e0 = (float  [2])uVar52;
                afStack_d8 = (float  [2])uVar51;
                afStack_d0 = (float  [2])uVar53;
                afStack_c8._0_8_ = uVar54;
                BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                          (&local_1c9,(__m256 *)local_e0,(__m256 *)&local_a0);
                *(undefined8 *)pfVar35 = uVar52;
                *(undefined8 *)(pfVar35 + 2) = uVar51;
                *(undefined8 *)(pfVar35 + 4) = uVar53;
                *(undefined8 *)(pfVar35 + 6) = uVar54;
                pfVar33 = pfVar33 + 8;
                pfVar35 = pfVar35 + 8;
              }
              for (; iVar43 + 3 < (int)local_160; iVar43 = iVar43 + 4) {
                local_e0 = *(float (*) [2])pfVar33;
                uVar52 = *(undefined8 *)(pfVar33 + 2);
                afStack_d8 = (float  [2])uVar52;
                afVar155 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                     (&local_1c9,(__m128 *)local_e0,&local_100);
                *(long *)pfVar35 = afVar155._0_8_;
                *(undefined8 *)(pfVar35 + 2) = uVar52;
                pfVar33 = pfVar33 + 4;
                pfVar35 = pfVar35 + 4;
              }
              for (; iVar43 < (int)local_160; iVar43 = iVar43 + 1) {
                fVar45 = atan2f((float)local_130._0_4_,*pfVar33);
                *pfVar35 = fVar45;
                pfVar33 = pfVar33 + 1;
                pfVar35 = pfVar35 + 1;
              }
              iVar23 = local_104;
              pvVar25 = (void *)((long)local_1b8 + 1);
            }
            pvVar36 = (void *)((long)local_138 + 1);
          }
          pvVar25 = (void *)((long)local_140 + 1);
        }
      }
    }
  }
  if (local_188 != (int *)0x0) {
    LOCK();
    *local_188 = *local_188 + -1;
    UNLOCK();
    if (*local_188 == 0) {
      if (local_190 == (Allocator *)0x0) {
        free(local_1c8);
        local_188 = extraout_RAX;
      }
      else {
        uVar24 = (*local_190->_vptr_Allocator[3])(local_190,local_1c8);
        local_188 = (int *)(ulong)uVar24;
      }
    }
  }
  return (int)local_188;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    // squeeze inner axes
    Mat b2 = b;
    if (b.dims == 2 && b.w == 1)
        b2 = b.reshape(b.h);
    else if (b.dims == 3 && b.h == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 3 && b.w == 1)
        b2 = b.reshape(b.h, b.c);
    else if (b.dims == 4 && b.d == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 4 && b.h == 1)
        b2 = b.reshape(b.d, b.c);
    else if (b.dims == 4 && b.w == 1)
        b2 = b.reshape(b.h, b.d, b.c);

    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_inner<binary_op_add>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_inner<binary_op_sub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_inner<binary_op_mul>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_inner<binary_op_div>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_inner<binary_op_max>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_inner<binary_op_min>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_inner<binary_op_pow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_inner<binary_op_rsub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_inner<binary_op_rdiv>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_inner<binary_op_rpow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_inner<binary_op_atan2>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_inner<binary_op_ratan2>(a, b2, c, opt);

    // should never reach here
    return 0;
}